

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void idct64_low8_ssse3(__m128i *input,__m128i *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined4 uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  __m128i alVar370;
  undefined2 local_498;
  undefined2 uStack_496;
  undefined2 uStack_494;
  undefined2 uStack_492;
  undefined2 uStack_490;
  undefined2 uStack_48e;
  undefined2 uStack_48c;
  undefined2 uStack_48a;
  undefined2 local_488;
  undefined2 uStack_486;
  undefined2 uStack_484;
  undefined2 uStack_482;
  undefined2 uStack_480;
  undefined2 uStack_47e;
  undefined2 uStack_47c;
  undefined2 uStack_47a;
  undefined2 local_478;
  undefined2 uStack_476;
  undefined2 uStack_474;
  undefined2 uStack_472;
  undefined2 uStack_470;
  undefined2 uStack_46e;
  undefined2 uStack_46c;
  undefined2 uStack_46a;
  undefined2 local_428;
  undefined2 uStack_426;
  undefined2 uStack_424;
  undefined2 uStack_422;
  undefined2 uStack_420;
  undefined2 uStack_41e;
  undefined2 uStack_41c;
  undefined2 uStack_41a;
  undefined2 local_3b8;
  undefined2 uStack_3b6;
  undefined2 uStack_3b4;
  undefined2 uStack_3b2;
  undefined2 uStack_3b0;
  undefined2 uStack_3ae;
  undefined2 uStack_3ac;
  undefined2 uStack_3aa;
  undefined2 local_3a8;
  undefined2 uStack_3a6;
  undefined2 uStack_3a4;
  undefined2 uStack_3a2;
  undefined2 uStack_3a0;
  undefined2 uStack_39e;
  undefined2 uStack_39c;
  undefined2 uStack_39a;
  undefined2 local_398;
  undefined2 uStack_396;
  undefined2 uStack_394;
  undefined2 uStack_392;
  undefined2 uStack_390;
  undefined2 uStack_38e;
  undefined2 uStack_38c;
  undefined2 uStack_38a;
  undefined2 local_378;
  undefined2 uStack_376;
  undefined2 uStack_374;
  undefined2 uStack_372;
  undefined2 uStack_370;
  undefined2 uStack_36e;
  undefined2 uStack_36c;
  undefined2 uStack_36a;
  undefined2 local_368;
  undefined2 uStack_366;
  undefined2 uStack_364;
  undefined2 uStack_362;
  undefined2 uStack_360;
  undefined2 uStack_35e;
  undefined2 uStack_35c;
  undefined2 uStack_35a;
  undefined2 local_358;
  undefined2 uStack_356;
  undefined2 uStack_354;
  undefined2 uStack_352;
  undefined2 uStack_350;
  undefined2 uStack_34e;
  undefined2 uStack_34c;
  undefined2 uStack_34a;
  undefined2 local_348;
  undefined2 uStack_346;
  undefined2 uStack_344;
  undefined2 uStack_342;
  undefined2 uStack_340;
  undefined2 uStack_33e;
  undefined2 uStack_33c;
  undefined2 uStack_33a;
  undefined2 local_308;
  undefined2 uStack_306;
  undefined2 uStack_304;
  undefined2 uStack_302;
  undefined2 uStack_300;
  undefined2 uStack_2fe;
  undefined2 uStack_2fc;
  undefined2 uStack_2fa;
  undefined2 local_178;
  undefined2 uStack_176;
  undefined2 uStack_174;
  undefined2 uStack_172;
  undefined2 uStack_170;
  undefined2 uStack_16e;
  undefined2 uStack_16c;
  undefined2 uStack_16a;
  undefined2 local_168;
  undefined2 uStack_166;
  undefined2 uStack_164;
  undefined2 uStack_162;
  undefined2 uStack_160;
  undefined2 uStack_15e;
  undefined2 uStack_15c;
  undefined2 uStack_15a;
  undefined2 local_158;
  undefined2 uStack_156;
  undefined2 uStack_154;
  undefined2 uStack_152;
  undefined2 uStack_150;
  undefined2 uStack_14e;
  undefined2 uStack_14c;
  undefined2 uStack_14a;
  undefined2 local_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 uStack_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 local_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  undefined2 local_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  undefined2 uStack_60;
  undefined2 uStack_5e;
  undefined2 uStack_5c;
  undefined2 uStack_5a;
  undefined2 local_58;
  undefined2 uStack_56;
  undefined2 uStack_54;
  undefined2 uStack_52;
  undefined2 uStack_50;
  undefined2 uStack_4e;
  undefined2 uStack_4c;
  undefined2 uStack_4a;
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined2 uStack_40;
  undefined2 uStack_3e;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  undefined1 auVar30 [16];
  undefined1 auVar35 [16];
  undefined1 auVar31 [16];
  undefined1 auVar36 [16];
  undefined1 auVar32 [16];
  undefined1 auVar37 [16];
  undefined1 auVar59 [16];
  undefined1 auVar74 [16];
  undefined1 auVar84 [16];
  undefined1 auVar98 [16];
  undefined1 auVar60 [16];
  undefined1 auVar75 [16];
  undefined1 auVar85 [16];
  undefined1 auVar99 [16];
  undefined1 auVar61 [16];
  undefined1 auVar76 [16];
  undefined1 auVar86 [16];
  undefined1 auVar100 [16];
  undefined1 auVar105 [16];
  undefined1 auVar125 [16];
  undefined1 auVar106 [16];
  undefined1 auVar126 [16];
  undefined1 auVar107 [16];
  undefined1 auVar127 [16];
  undefined1 auVar134 [16];
  undefined1 auVar141 [16];
  undefined1 auVar149 [16];
  undefined1 auVar156 [16];
  undefined1 auVar161 [16];
  undefined1 auVar169 [16];
  undefined1 auVar135 [16];
  undefined1 auVar142 [16];
  undefined1 auVar150 [16];
  undefined1 auVar157 [16];
  undefined1 auVar162 [16];
  undefined1 auVar170 [16];
  undefined1 auVar136 [16];
  undefined1 auVar143 [16];
  undefined1 auVar151 [16];
  undefined1 auVar158 [16];
  undefined1 auVar163 [16];
  undefined1 auVar171 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar208 [16];
  undefined1 auVar218 [16];
  undefined1 auVar223 [16];
  undefined1 auVar209 [16];
  undefined1 auVar219 [16];
  undefined1 auVar224 [16];
  undefined1 auVar210 [16];
  undefined1 auVar220 [16];
  undefined1 auVar225 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar258 [16];
  undefined1 auVar273 [16];
  undefined1 auVar283 [16];
  undefined1 auVar259 [16];
  undefined1 auVar274 [16];
  undefined1 auVar284 [16];
  undefined1 auVar260 [16];
  undefined1 auVar275 [16];
  undefined1 auVar285 [16];
  undefined1 auVar292 [16];
  undefined1 auVar302 [16];
  undefined1 auVar293 [16];
  undefined1 auVar303 [16];
  undefined1 auVar294 [16];
  undefined1 auVar304 [16];
  undefined1 auVar314 [16];
  undefined1 auVar320 [16];
  undefined1 auVar315 [16];
  undefined1 auVar321 [16];
  undefined1 auVar316 [16];
  undefined1 auVar322 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  
  auVar205 = pshuflw(ZEXT416(0x328),ZEXT416(0x328),0);
  uVar53 = auVar205._0_4_;
  auVar227._4_4_ = uVar53;
  auVar227._0_4_ = uVar53;
  auVar227._8_4_ = uVar53;
  auVar227._12_4_ = uVar53;
  auVar205 = pshuflw(ZEXT416(0x7ff8),ZEXT416(0x7ff8),0);
  uVar53 = auVar205._0_4_;
  auVar306._4_4_ = uVar53;
  auVar306._0_4_ = uVar53;
  auVar306._8_4_ = uVar53;
  auVar306._12_4_ = uVar53;
  auVar228 = pmulhrsw(auVar227,(undefined1  [16])input[1]);
  auVar307 = pmulhrsw(auVar306,(undefined1  [16])input[1]);
  auVar205 = pshuflw(ZEXT416(0xffffea20),ZEXT416(0xffffea20),0);
  auVar205._4_4_ = auVar205._0_4_;
  auVar205._8_4_ = auVar205._0_4_;
  auVar205._12_4_ = auVar205._0_4_;
  auVar206 = pshuflw(ZEXT416(0x7e20),ZEXT416(0x7e20),0);
  uVar53 = auVar206._0_4_;
  auVar357._4_4_ = uVar53;
  auVar357._0_4_ = uVar53;
  auVar357._8_4_ = uVar53;
  auVar357._12_4_ = uVar53;
  auVar205 = pmulhrsw(auVar205,(undefined1  [16])input[7]);
  auVar358 = pmulhrsw(auVar357,(undefined1  [16])input[7]);
  auVar206 = pshuflw(ZEXT416(0xfa8),ZEXT416(0xfa8),0);
  uVar53 = auVar206._0_4_;
  auVar255._4_4_ = uVar53;
  auVar255._0_4_ = uVar53;
  auVar255._8_4_ = uVar53;
  auVar255._12_4_ = uVar53;
  auVar206 = pshuflw(ZEXT416(0x7f08),ZEXT416(0x7f08),0);
  uVar53 = auVar206._0_4_;
  auVar287._4_4_ = uVar53;
  auVar287._0_4_ = uVar53;
  auVar287._8_4_ = uVar53;
  auVar287._12_4_ = uVar53;
  auVar256 = pmulhrsw(auVar255,(undefined1  [16])input[5]);
  auVar288 = pmulhrsw(auVar287,(undefined1  [16])input[5]);
  auVar206 = pshuflw(ZEXT416(0xfffff698),ZEXT416(0xfffff698),0);
  uVar53 = auVar206._0_4_;
  auVar242._4_4_ = uVar53;
  auVar242._0_4_ = uVar53;
  auVar242._8_4_ = uVar53;
  auVar242._12_4_ = uVar53;
  auVar206 = pshuflw(ZEXT416(0x7fa8),ZEXT416(0x7fa8),0);
  uVar53 = auVar206._0_4_;
  auVar343._4_4_ = uVar53;
  auVar343._0_4_ = uVar53;
  auVar343._8_4_ = uVar53;
  auVar343._12_4_ = uVar53;
  auVar243 = pmulhrsw(auVar242,(undefined1  [16])input[3]);
  auVar344 = pmulhrsw(auVar343,(undefined1  [16])input[3]);
  auVar206 = pshuflw(ZEXT416(0x648),ZEXT416(0x648),0);
  uVar53 = auVar206._0_4_;
  auVar187._4_4_ = uVar53;
  auVar187._0_4_ = uVar53;
  auVar187._8_4_ = uVar53;
  auVar187._12_4_ = uVar53;
  auVar206 = pshuflw(ZEXT416(0x7fd8),ZEXT416(0x7fd8),0);
  uVar53 = auVar206._0_4_;
  auVar54._4_4_ = uVar53;
  auVar54._0_4_ = uVar53;
  auVar54._8_4_ = uVar53;
  auVar54._12_4_ = uVar53;
  auVar188 = pmulhrsw(auVar187,(undefined1  [16])input[2]);
  auVar55 = pmulhrsw(auVar54,(undefined1  [16])input[2]);
  auVar206 = pshuflw(ZEXT416(0xffffed38),ZEXT416(0xffffed38),0);
  uVar53 = auVar206._0_4_;
  auVar175._4_4_ = uVar53;
  auVar175._0_4_ = uVar53;
  auVar175._8_4_ = uVar53;
  auVar175._12_4_ = uVar53;
  auVar206 = pshuflw(ZEXT416(0x7ea0),ZEXT416(0x7ea0),0);
  auVar129._0_4_ = auVar206._0_4_;
  auVar129._4_4_ = auVar129._0_4_;
  auVar129._8_4_ = auVar129._0_4_;
  auVar129._12_4_ = auVar129._0_4_;
  auVar176 = pmulhrsw(auVar175,(undefined1  [16])input[6]);
  auVar130 = pmulhrsw(auVar129,(undefined1  [16])input[6]);
  auVar206 = pshuflw(ZEXT416(0xc88),ZEXT416(0xc88),0);
  uVar53 = auVar206._0_4_;
  auVar177._4_4_ = uVar53;
  auVar177._0_4_ = uVar53;
  auVar177._8_4_ = uVar53;
  auVar177._12_4_ = uVar53;
  auVar206 = pshuflw(ZEXT416(0x7f60),ZEXT416(0x7f60),0);
  uVar53 = auVar206._0_4_;
  auVar56._4_4_ = uVar53;
  auVar56._0_4_ = uVar53;
  auVar56._8_4_ = uVar53;
  auVar56._12_4_ = uVar53;
  auVar178 = pmulhrsw(auVar177,(undefined1  [16])input[4]);
  auVar57 = pmulhrsw(auVar56,(undefined1  [16])input[4]);
  auVar210._0_12_ = auVar228._0_12_;
  auVar210._12_2_ = auVar228._6_2_;
  auVar210._14_2_ = auVar307._6_2_;
  auVar209._12_4_ = auVar210._12_4_;
  auVar209._0_10_ = auVar228._0_10_;
  auVar209._10_2_ = auVar307._4_2_;
  auVar208._10_6_ = auVar209._10_6_;
  auVar208._0_8_ = auVar228._0_8_;
  auVar208._8_2_ = auVar228._4_2_;
  auVar207._8_8_ = auVar208._8_8_;
  auVar207._6_2_ = auVar307._2_2_;
  auVar207._4_2_ = auVar228._2_2_;
  auVar207._0_2_ = auVar228._0_2_;
  auVar207._2_2_ = auVar307._0_2_;
  auVar229._2_2_ = auVar307._8_2_;
  auVar229._0_2_ = auVar228._8_2_;
  auVar229._4_2_ = auVar228._10_2_;
  auVar229._6_2_ = auVar307._10_2_;
  auVar229._8_2_ = auVar228._12_2_;
  auVar229._10_2_ = auVar307._12_2_;
  auVar229._12_2_ = auVar228._14_2_;
  auVar229._14_2_ = auVar307._14_2_;
  auVar79._8_4_ = 0x191f014;
  auVar79._0_8_ = 0x191f0140191f014;
  auVar79._12_4_ = 0x191f014;
  auVar325 = pmaddwd(auVar207,auVar79);
  auVar206 = pmaddwd(auVar79,auVar229);
  auVar326._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar326._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar326._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar326._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar310._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar310._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar310._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar310._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar327 = packssdw(auVar326,auVar310);
  auVar269._8_4_ = 0xfec0191;
  auVar269._0_8_ = 0xfec01910fec0191;
  auVar269._12_4_ = 0xfec0191;
  auVar325 = pmaddwd(auVar207,auVar269);
  auVar206 = pmaddwd(auVar269,auVar229);
  auVar211._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar211._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar211._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar211._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar296._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar296._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar296._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar296._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar212 = packssdw(auVar211,auVar296);
  auVar4 = paddsw(auVar228,auVar205);
  auVar189 = psubsw(auVar228,auVar205);
  auVar330._0_12_ = auVar205._0_12_;
  auVar330._12_2_ = auVar205._6_2_;
  auVar330._14_2_ = auVar358._6_2_;
  auVar366._12_4_ = auVar330._12_4_;
  auVar366._0_10_ = auVar205._0_10_;
  auVar366._10_2_ = auVar358._4_2_;
  auVar110._10_6_ = auVar366._10_6_;
  auVar110._0_8_ = auVar205._0_8_;
  auVar110._8_2_ = auVar205._4_2_;
  auVar115._8_8_ = auVar110._8_8_;
  auVar115._6_2_ = auVar358._2_2_;
  auVar115._4_2_ = auVar205._2_2_;
  auVar115._0_2_ = auVar205._0_2_;
  auVar115._2_2_ = auVar358._0_2_;
  auVar213._2_2_ = auVar358._8_2_;
  auVar213._0_2_ = auVar205._8_2_;
  auVar213._4_2_ = auVar205._10_2_;
  auVar213._6_2_ = auVar358._10_2_;
  auVar213._8_2_ = auVar205._12_2_;
  auVar213._10_2_ = auVar358._12_2_;
  auVar213._12_2_ = auVar205._14_2_;
  auVar213._14_2_ = auVar358._14_2_;
  auVar206._8_4_ = 0xf5daf3a2;
  auVar206._0_8_ = 0xf5daf3a2f5daf3a2;
  auVar206._12_4_ = 0xf5daf3a2;
  auVar325 = pmaddwd(auVar115,auVar206);
  auVar205 = pmaddwd(auVar206,auVar213);
  auVar190._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar190._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar190._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar190._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar325._0_4_ = auVar205._0_4_ + 0x800 >> 0xc;
  auVar325._4_4_ = auVar205._4_4_ + 0x800 >> 0xc;
  auVar325._8_4_ = auVar205._8_4_ + 0x800 >> 0xc;
  auVar325._12_4_ = auVar205._12_4_ + 0x800 >> 0xc;
  auVar191 = packssdw(auVar190,auVar325);
  auVar228._8_4_ = 0xc5ef5da;
  auVar228._0_8_ = 0xc5ef5da0c5ef5da;
  auVar228._12_4_ = 0xc5ef5da;
  auVar206 = pmaddwd(auVar115,auVar228);
  auVar205 = pmaddwd(auVar228,auVar213);
  auVar328._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar328._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar328._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar328._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar266._0_4_ = auVar205._0_4_ + 0x800 >> 0xc;
  auVar266._4_4_ = auVar205._4_4_ + 0x800 >> 0xc;
  auVar266._8_4_ = auVar205._8_4_ + 0x800 >> 0xc;
  auVar266._12_4_ = auVar205._12_4_ + 0x800 >> 0xc;
  auVar5 = packssdw(auVar328,auVar266);
  auVar205 = psubsw(auVar243,auVar256);
  auVar244 = paddsw(auVar243,auVar256);
  auVar260._0_12_ = auVar256._0_12_;
  auVar260._12_2_ = auVar256._6_2_;
  auVar260._14_2_ = auVar288._6_2_;
  auVar259._12_4_ = auVar260._12_4_;
  auVar259._0_10_ = auVar256._0_10_;
  auVar259._10_2_ = auVar288._4_2_;
  auVar258._10_6_ = auVar259._10_6_;
  auVar258._0_8_ = auVar256._0_8_;
  auVar258._8_2_ = auVar256._4_2_;
  auVar257._8_8_ = auVar258._8_8_;
  auVar257._6_2_ = auVar288._2_2_;
  auVar257._4_2_ = auVar256._2_2_;
  auVar257._0_2_ = auVar256._0_2_;
  auVar257._2_2_ = auVar288._0_2_;
  auVar367._2_2_ = auVar288._8_2_;
  auVar367._0_2_ = auVar256._8_2_;
  auVar367._4_2_ = auVar256._10_2_;
  auVar367._6_2_ = auVar288._10_2_;
  auVar367._8_2_ = auVar256._12_2_;
  auVar367._10_2_ = auVar288._12_2_;
  auVar367._12_2_ = auVar256._14_2_;
  auVar367._14_2_ = auVar288._14_2_;
  auVar256._8_4_ = 0x78bf1e4;
  auVar256._0_8_ = 0x78bf1e4078bf1e4;
  auVar256._12_4_ = 0x78bf1e4;
  auVar325 = pmaddwd(auVar257,auVar256);
  auVar206 = pmaddwd(auVar256,auVar367);
  auVar359._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar359._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar359._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar359._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar68._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar68._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar68._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar68._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar360 = packssdw(auVar359,auVar68);
  auVar230._8_4_ = 0xe1c078b;
  auVar230._0_8_ = 0xe1c078b0e1c078b;
  auVar230._12_4_ = 0xe1c078b;
  auVar325 = pmaddwd(auVar257,auVar230);
  auVar206 = pmaddwd(auVar230,auVar367);
  auVar261._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar261._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar261._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar261._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar120._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar120._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar120._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar120._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar262 = packssdw(auVar261,auVar120);
  auVar61._0_12_ = auVar243._0_12_;
  auVar61._12_2_ = auVar243._6_2_;
  auVar61._14_2_ = auVar344._6_2_;
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._0_10_ = auVar243._0_10_;
  auVar60._10_2_ = auVar344._4_2_;
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._0_8_ = auVar243._0_8_;
  auVar59._8_2_ = auVar243._4_2_;
  auVar58._8_8_ = auVar59._8_8_;
  auVar58._6_2_ = auVar344._2_2_;
  auVar58._4_2_ = auVar243._2_2_;
  auVar58._0_2_ = auVar243._0_2_;
  auVar58._2_2_ = auVar344._0_2_;
  auVar102._2_2_ = auVar344._8_2_;
  auVar102._0_2_ = auVar243._8_2_;
  auVar102._4_2_ = auVar243._10_2_;
  auVar102._6_2_ = auVar344._10_2_;
  auVar102._8_2_ = auVar243._12_2_;
  auVar102._10_2_ = auVar344._12_2_;
  auVar102._12_2_ = auVar243._14_2_;
  auVar102._14_2_ = auVar344._14_2_;
  auVar243._8_4_ = 0xfb5bf0b0;
  auVar243._0_8_ = 0xfb5bf0b0fb5bf0b0;
  auVar243._12_4_ = 0xfb5bf0b0;
  auVar325 = pmaddwd(auVar58,auVar243);
  auVar206 = pmaddwd(auVar243,auVar102);
  auVar245._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar245._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar245._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar245._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar139._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar139._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar139._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar139._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar246 = packssdw(auVar245,auVar139);
  auVar63._8_4_ = 0xf50fb5b;
  auVar63._0_8_ = 0xf50fb5b0f50fb5b;
  auVar63._12_4_ = 0xf50fb5b;
  auVar325 = pmaddwd(auVar58,auVar63);
  auVar206 = pmaddwd(auVar63,auVar102);
  auVar62._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar62._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar62._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar62._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar145._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar145._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar145._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar145._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar63 = packssdw(auVar62,auVar145);
  local_3a8 = auVar55._0_2_;
  uStack_3a6 = auVar55._2_2_;
  uStack_3a4 = auVar55._4_2_;
  uStack_3a2 = auVar55._6_2_;
  uStack_3a0 = auVar55._8_2_;
  uStack_39e = auVar55._10_2_;
  uStack_39c = auVar55._12_2_;
  uStack_39a = auVar55._14_2_;
  auVar263._0_12_ = auVar188._0_12_;
  auVar263._12_2_ = auVar188._6_2_;
  auVar263._14_2_ = uStack_3a2;
  auVar182._12_4_ = auVar263._12_4_;
  auVar182._0_10_ = auVar188._0_10_;
  auVar182._10_2_ = uStack_3a4;
  auVar233._10_6_ = auVar182._10_6_;
  auVar233._0_8_ = auVar188._0_8_;
  auVar233._8_2_ = auVar188._4_2_;
  auVar166._8_8_ = auVar233._8_8_;
  auVar166._6_2_ = uStack_3a6;
  auVar166._4_2_ = auVar188._2_2_;
  auVar166._0_2_ = auVar188._0_2_;
  auVar166._2_2_ = local_3a8;
  auVar103._2_2_ = uStack_3a0;
  auVar103._0_2_ = auVar188._8_2_;
  auVar103._4_2_ = auVar188._10_2_;
  auVar103._6_2_ = uStack_39e;
  auVar103._8_2_ = auVar188._12_2_;
  auVar103._10_2_ = uStack_39c;
  auVar103._12_2_ = auVar188._14_2_;
  auVar103._14_2_ = uStack_39a;
  auVar308._8_4_ = 0x31ff04f;
  auVar308._0_8_ = 0x31ff04f031ff04f;
  auVar308._12_4_ = 0x31ff04f;
  auVar325 = pmaddwd(auVar166,auVar308);
  auVar206 = pmaddwd(auVar103,auVar308);
  auVar64._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar64._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar64._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar64._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar248._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar248._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar248._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar248._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar256 = packssdw(auVar64,auVar248);
  auVar345._8_4_ = 0xfb1031f;
  auVar345._0_8_ = 0xfb1031f0fb1031f;
  auVar345._12_4_ = 0xfb1031f;
  auVar325 = pmaddwd(auVar166,auVar345);
  auVar206 = pmaddwd(auVar103,auVar345);
  auVar65._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar65._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar65._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar65._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar277._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar277._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar277._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar277._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar66 = packssdw(auVar65,auVar277);
  auVar6 = paddsw(auVar188,auVar176);
  auVar263 = psubsw(auVar188,auVar176);
  auVar107._0_12_ = auVar176._0_12_;
  auVar107._12_2_ = auVar176._6_2_;
  auVar107._14_2_ = auVar130._6_2_;
  auVar106._12_4_ = auVar107._12_4_;
  auVar106._0_10_ = auVar176._0_10_;
  auVar106._10_2_ = auVar130._4_2_;
  auVar105._10_6_ = auVar106._10_6_;
  auVar105._0_8_ = auVar176._0_8_;
  auVar105._8_2_ = auVar176._4_2_;
  auVar104._8_8_ = auVar105._8_8_;
  auVar104._6_2_ = auVar130._2_2_;
  auVar104._4_2_ = auVar176._2_2_;
  auVar104._0_2_ = auVar176._0_2_;
  auVar104._2_2_ = auVar130._0_2_;
  auVar247._2_2_ = auVar130._8_2_;
  auVar247._0_2_ = auVar176._8_2_;
  auVar247._4_2_ = auVar176._10_2_;
  auVar247._6_2_ = auVar130._10_2_;
  auVar247._8_2_ = auVar176._12_2_;
  auVar247._10_2_ = auVar130._12_2_;
  auVar247._12_2_ = auVar176._14_2_;
  auVar247._14_2_ = auVar130._14_2_;
  auVar289._8_4_ = 0xf71cf2b2;
  auVar289._0_8_ = 0xf71cf2b2f71cf2b2;
  auVar289._12_4_ = 0xf71cf2b2;
  auVar325 = pmaddwd(auVar104,auVar289);
  auVar206 = pmaddwd(auVar247,auVar289);
  auVar67._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar67._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar67._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar67._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar281._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar281._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar281._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar281._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar68 = packssdw(auVar67,auVar281);
  auVar69._8_4_ = 0xd4ef71c;
  auVar69._0_8_ = 0xd4ef71c0d4ef71c;
  auVar69._12_4_ = 0xd4ef71c;
  auVar325 = pmaddwd(auVar104,auVar69);
  auVar206 = pmaddwd(auVar247,auVar69);
  auVar131._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar131._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar131._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar131._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar298._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar298._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar298._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar298._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar132 = packssdw(auVar131,auVar298);
  auVar206 = pshuflw(ZEXT416(0x5a80),ZEXT416(0x5a80),0);
  auVar318._0_4_ = auVar206._0_4_;
  auVar318._4_4_ = auVar318._0_4_;
  auVar318._8_4_ = auVar318._0_4_;
  auVar318._12_4_ = auVar318._0_4_;
  auVar7 = pmulhrsw(auVar318,(undefined1  [16])*input);
  auVar248 = paddsw(auVar7,auVar178);
  auVar8 = psubsw(auVar7,auVar178);
  local_168 = auVar57._0_2_;
  uStack_166 = auVar57._2_2_;
  uStack_164 = auVar57._4_2_;
  uStack_162 = auVar57._6_2_;
  uStack_160 = auVar57._8_2_;
  uStack_15e = auVar57._10_2_;
  uStack_15c = auVar57._12_2_;
  uStack_15a = auVar57._14_2_;
  auVar136._0_12_ = auVar178._0_12_;
  auVar136._12_2_ = auVar178._6_2_;
  auVar136._14_2_ = uStack_162;
  auVar135._12_4_ = auVar136._12_4_;
  auVar135._0_10_ = auVar178._0_10_;
  auVar135._10_2_ = uStack_164;
  auVar134._10_6_ = auVar135._10_6_;
  auVar134._0_8_ = auVar178._0_8_;
  auVar134._8_2_ = auVar178._4_2_;
  auVar133._8_8_ = auVar134._8_8_;
  auVar133._6_2_ = uStack_166;
  auVar133._4_2_ = auVar178._2_2_;
  auVar133._0_2_ = auVar178._0_2_;
  auVar133._2_2_ = local_168;
  auVar108._2_2_ = uStack_160;
  auVar108._0_2_ = auVar178._8_2_;
  auVar108._4_2_ = auVar178._10_2_;
  auVar108._6_2_ = uStack_15e;
  auVar108._8_2_ = auVar178._12_2_;
  auVar108._10_2_ = uStack_15c;
  auVar108._12_2_ = auVar178._14_2_;
  auVar108._14_2_ = uStack_15a;
  auVar176._8_4_ = 0x61ff138;
  auVar176._0_8_ = 0x61ff138061ff138;
  auVar176._12_4_ = 0x61ff138;
  auVar325 = pmaddwd(auVar133,auVar176);
  auVar206 = pmaddwd(auVar108,auVar176);
  auVar264._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar264._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar264._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar264._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar331._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar331._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar331._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar331._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar265 = packssdw(auVar264,auVar331);
  auVar178._8_4_ = 0xec8061f;
  auVar178._0_8_ = 0xec8061f0ec8061f;
  auVar178._12_4_ = 0xec8061f;
  auVar325 = pmaddwd(auVar133,auVar178);
  auVar206 = pmaddwd(auVar108,auVar178);
  auVar109._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar109._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar109._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar109._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar336._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar336._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar336._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar336._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar110 = packssdw(auVar109,auVar336);
  auVar252._0_12_ = auVar327._0_12_;
  auVar252._12_2_ = auVar327._6_2_;
  auVar252._14_2_ = auVar212._6_2_;
  auVar251._12_4_ = auVar252._12_4_;
  auVar251._0_10_ = auVar327._0_10_;
  auVar251._10_2_ = auVar212._4_2_;
  auVar250._10_6_ = auVar251._10_6_;
  auVar250._0_8_ = auVar327._0_8_;
  auVar250._8_2_ = auVar327._4_2_;
  auVar249._8_8_ = auVar250._8_8_;
  auVar249._6_2_ = auVar212._2_2_;
  auVar249._4_2_ = auVar327._2_2_;
  auVar249._0_2_ = auVar327._0_2_;
  auVar249._2_2_ = auVar212._0_2_;
  auVar337._2_2_ = auVar212._8_2_;
  auVar337._0_2_ = auVar327._8_2_;
  auVar337._4_2_ = auVar327._10_2_;
  auVar337._6_2_ = auVar212._10_2_;
  auVar337._8_2_ = auVar327._12_2_;
  auVar337._10_2_ = auVar212._12_2_;
  auVar337._12_2_ = auVar327._14_2_;
  auVar337._14_2_ = auVar212._14_2_;
  auVar325 = pmaddwd(auVar249,auVar308);
  auVar206 = pmaddwd(auVar337,auVar308);
  auVar137._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar137._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar137._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar137._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar111._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar111._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar111._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar111._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar243 = packssdw(auVar137,auVar111);
  auVar325 = pmaddwd(auVar249,auVar345);
  auVar206 = pmaddwd(auVar337,auVar345);
  auVar253._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar253._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar253._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar253._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar349._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar349._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar349._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar349._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar254 = packssdw(auVar253,auVar349);
  auVar325 = pmaddwd(auVar207,auVar345);
  auVar228 = pmaddwd(auVar229,auVar345);
  auVar266 = pmaddwd(auVar207,auVar308);
  auVar206 = pmaddwd(auVar229,auVar308);
  auVar267._0_4_ = auVar266._0_4_ + 0x800 >> 0xc;
  auVar267._4_4_ = auVar266._4_4_ + 0x800 >> 0xc;
  auVar267._8_4_ = auVar266._8_4_ + 0x800 >> 0xc;
  auVar267._12_4_ = auVar266._12_4_ + 0x800 >> 0xc;
  auVar369._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar369._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar369._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar369._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar268 = packssdw(auVar267,auVar369);
  auVar112._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar112._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar112._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar112._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar179._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar179._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar179._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar179._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar113 = packssdw(auVar112,auVar179);
  auVar9._8_4_ = 0xf04ffce1;
  auVar9._0_8_ = 0xf04ffce1f04ffce1;
  auVar9._12_4_ = 0xf04ffce1;
  auVar325 = pmaddwd(auVar115,auVar9);
  auVar206 = pmaddwd(auVar213,auVar9);
  auVar138._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar138._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar138._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar138._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar114._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar114._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar114._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar114._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar139 = packssdw(auVar138,auVar114);
  auVar325 = pmaddwd(auVar115,auVar308);
  auVar206 = pmaddwd(auVar213,auVar308);
  auVar309._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar309._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar309._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar309._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar214._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar214._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar214._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar214._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar310 = packssdw(auVar309,auVar214);
  auVar115 = paddsw(auVar327,auVar191);
  auVar328 = psubsw(auVar327,auVar191);
  local_378 = auVar5._0_2_;
  uStack_376 = auVar5._2_2_;
  uStack_374 = auVar5._4_2_;
  uStack_372 = auVar5._6_2_;
  uStack_370 = auVar5._8_2_;
  uStack_36e = auVar5._10_2_;
  uStack_36c = auVar5._12_2_;
  uStack_36a = auVar5._14_2_;
  auVar195._0_12_ = auVar191._0_12_;
  auVar195._12_2_ = auVar191._6_2_;
  auVar195._14_2_ = uStack_372;
  auVar194._12_4_ = auVar195._12_4_;
  auVar194._0_10_ = auVar191._0_10_;
  auVar194._10_2_ = uStack_374;
  auVar193._10_6_ = auVar194._10_6_;
  auVar193._0_8_ = auVar191._0_8_;
  auVar193._8_2_ = auVar191._4_2_;
  auVar192._8_8_ = auVar193._8_8_;
  auVar192._6_2_ = uStack_376;
  auVar192._4_2_ = auVar191._2_2_;
  auVar192._0_2_ = auVar191._0_2_;
  auVar192._2_2_ = local_378;
  auVar116._2_2_ = uStack_370;
  auVar116._0_2_ = auVar191._8_2_;
  auVar116._4_2_ = auVar191._10_2_;
  auVar116._6_2_ = uStack_36e;
  auVar116._8_2_ = auVar191._12_2_;
  auVar116._10_2_ = uStack_36c;
  auVar116._12_2_ = auVar191._14_2_;
  auVar116._14_2_ = uStack_36a;
  auVar266 = pmaddwd(auVar192,auVar9);
  auVar206 = pmaddwd(auVar9,auVar116);
  auVar228 = pmaddwd(auVar192,auVar308);
  auVar325 = pmaddwd(auVar116,auVar308);
  auVar346._0_4_ = auVar266._0_4_ + 0x800 >> 0xc;
  auVar346._4_4_ = auVar266._4_4_ + 0x800 >> 0xc;
  auVar346._8_4_ = auVar266._8_4_ + 0x800 >> 0xc;
  auVar346._12_4_ = auVar266._12_4_ + 0x800 >> 0xc;
  auVar10._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar347 = packssdw(auVar346,auVar10);
  auVar196._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar196._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar196._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar196._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar117._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar117._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar117._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar117._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar197 = packssdw(auVar196,auVar117);
  auVar206 = psubsw(auVar246,auVar360);
  auVar11 = paddsw(auVar246,auVar360);
  local_308 = auVar262._0_2_;
  uStack_306 = auVar262._2_2_;
  uStack_304 = auVar262._4_2_;
  uStack_302 = auVar262._6_2_;
  uStack_300 = auVar262._8_2_;
  uStack_2fe = auVar262._10_2_;
  uStack_2fc = auVar262._12_2_;
  uStack_2fa = auVar262._14_2_;
  auVar364._0_12_ = auVar360._0_12_;
  auVar364._12_2_ = auVar360._6_2_;
  auVar364._14_2_ = uStack_302;
  auVar363._12_4_ = auVar364._12_4_;
  auVar363._0_10_ = auVar360._0_10_;
  auVar363._10_2_ = uStack_304;
  auVar362._10_6_ = auVar363._10_6_;
  auVar362._0_8_ = auVar360._0_8_;
  auVar362._8_2_ = auVar360._4_2_;
  auVar361._8_8_ = auVar362._8_8_;
  auVar361._6_2_ = uStack_306;
  auVar361._4_2_ = auVar360._2_2_;
  auVar361._0_2_ = auVar360._0_2_;
  auVar361._2_2_ = local_308;
  auVar12._2_2_ = uStack_300;
  auVar12._0_2_ = auVar360._8_2_;
  auVar12._4_2_ = auVar360._10_2_;
  auVar12._6_2_ = uStack_2fe;
  auVar12._8_2_ = auVar360._12_2_;
  auVar12._10_2_ = uStack_2fc;
  auVar12._12_2_ = auVar360._14_2_;
  auVar12._14_2_ = uStack_2fa;
  auVar228 = pmaddwd(auVar361,auVar69);
  auVar325 = pmaddwd(auVar12,auVar69);
  auVar311._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar311._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar311._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar311._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar118._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar118._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar118._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar118._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar312 = packssdw(auVar311,auVar118);
  auVar180._8_4_ = 0x8e40d4e;
  auVar180._0_8_ = 0x8e40d4e08e40d4e;
  auVar180._12_4_ = 0x8e40d4e;
  auVar228 = pmaddwd(auVar361,auVar180);
  auVar325 = pmaddwd(auVar12,auVar180);
  auVar365._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar365._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar365._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar365._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar13._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar13._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar13._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar13._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar366 = packssdw(auVar365,auVar13);
  auVar266 = pmaddwd(auVar257,auVar180);
  auVar230 = pmaddwd(auVar367,auVar180);
  auVar228 = pmaddwd(auVar257,auVar69);
  auVar325 = pmaddwd(auVar367,auVar69);
  auVar119._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar119._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar119._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar119._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar14._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar14._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar14._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar14._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar120 = packssdw(auVar119,auVar14);
  auVar198._0_4_ = auVar266._0_4_ + 0x800 >> 0xc;
  auVar198._4_4_ = auVar266._4_4_ + 0x800 >> 0xc;
  auVar198._8_4_ = auVar266._8_4_ + 0x800 >> 0xc;
  auVar198._12_4_ = auVar266._12_4_ + 0x800 >> 0xc;
  auVar231._0_4_ = auVar230._0_4_ + 0x800 >> 0xc;
  auVar231._4_4_ = auVar230._4_4_ + 0x800 >> 0xc;
  auVar231._8_4_ = auVar230._8_4_ + 0x800 >> 0xc;
  auVar231._12_4_ = auVar230._12_4_ + 0x800 >> 0xc;
  auVar199 = packssdw(auVar198,auVar231);
  auVar228 = pmaddwd(auVar58,auVar289);
  auVar325 = pmaddwd(auVar102,auVar289);
  auVar200._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar200._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar200._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar200._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar15._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar15._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar15._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar15._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar201 = packssdw(auVar200,auVar15);
  auVar325 = pmaddwd(auVar58,auVar69);
  auVar228 = pmaddwd(auVar102,auVar69);
  auVar16._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar16._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar16._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar16._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar181._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar181._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar181._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar181._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar17 = packssdw(auVar16,auVar181);
  local_488 = auVar63._0_2_;
  uStack_486 = auVar63._2_2_;
  uStack_484 = auVar63._4_2_;
  uStack_482 = auVar63._6_2_;
  uStack_480 = auVar63._8_2_;
  uStack_47e = auVar63._10_2_;
  uStack_47c = auVar63._12_2_;
  uStack_47a = auVar63._14_2_;
  auVar143._0_12_ = auVar246._0_12_;
  auVar143._12_2_ = auVar246._6_2_;
  auVar143._14_2_ = uStack_482;
  auVar142._12_4_ = auVar143._12_4_;
  auVar142._0_10_ = auVar246._0_10_;
  auVar142._10_2_ = uStack_484;
  auVar141._10_6_ = auVar142._10_6_;
  auVar141._0_8_ = auVar246._0_8_;
  auVar141._8_2_ = auVar246._4_2_;
  auVar140._8_8_ = auVar141._8_8_;
  auVar140._6_2_ = uStack_486;
  auVar140._4_2_ = auVar246._2_2_;
  auVar140._0_2_ = auVar246._0_2_;
  auVar140._2_2_ = local_488;
  auVar188._2_2_ = uStack_480;
  auVar188._0_2_ = auVar246._8_2_;
  auVar188._4_2_ = auVar246._10_2_;
  auVar188._6_2_ = uStack_47e;
  auVar188._8_2_ = auVar246._12_2_;
  auVar188._10_2_ = uStack_47c;
  auVar188._12_2_ = auVar246._14_2_;
  auVar188._14_2_ = uStack_47a;
  auVar228 = pmaddwd(auVar140,auVar289);
  auVar230 = pmaddwd(auVar289,auVar188);
  auVar266 = pmaddwd(auVar140,auVar69);
  auVar325 = pmaddwd(auVar188,auVar69);
  auVar18._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar18._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar18._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar18._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar290._0_4_ = auVar230._0_4_ + 0x800 >> 0xc;
  auVar290._4_4_ = auVar230._4_4_ + 0x800 >> 0xc;
  auVar290._8_4_ = auVar230._8_4_ + 0x800 >> 0xc;
  auVar290._12_4_ = auVar230._12_4_ + 0x800 >> 0xc;
  auVar230 = packssdw(auVar18,auVar290);
  auVar144._0_4_ = auVar266._0_4_ + 0x800 >> 0xc;
  auVar144._4_4_ = auVar266._4_4_ + 0x800 >> 0xc;
  auVar144._8_4_ = auVar266._8_4_ + 0x800 >> 0xc;
  auVar144._12_4_ = auVar266._12_4_ + 0x800 >> 0xc;
  auVar191._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar191._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar191._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar191._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar145 = packssdw(auVar144,auVar191);
  local_3b8 = auVar66._0_2_;
  uStack_3b6 = auVar66._2_2_;
  uStack_3b4 = auVar66._4_2_;
  uStack_3b2 = auVar66._6_2_;
  uStack_3b0 = auVar66._8_2_;
  uStack_3ae = auVar66._10_2_;
  uStack_3ac = auVar66._12_2_;
  uStack_3aa = auVar66._14_2_;
  auVar294._0_12_ = auVar256._0_12_;
  auVar294._12_2_ = auVar256._6_2_;
  auVar294._14_2_ = uStack_3b2;
  auVar293._12_4_ = auVar294._12_4_;
  auVar293._0_10_ = auVar256._0_10_;
  auVar293._10_2_ = uStack_3b4;
  auVar292._10_6_ = auVar293._10_6_;
  auVar292._0_8_ = auVar256._0_8_;
  auVar292._8_2_ = auVar256._4_2_;
  auVar291._8_8_ = auVar292._8_8_;
  auVar291._6_2_ = uStack_3b6;
  auVar291._4_2_ = auVar256._2_2_;
  auVar291._0_2_ = auVar256._0_2_;
  auVar291._2_2_ = local_3b8;
  auVar246._2_2_ = uStack_3b0;
  auVar246._0_2_ = auVar256._8_2_;
  auVar246._4_2_ = auVar256._10_2_;
  auVar246._6_2_ = uStack_3ae;
  auVar246._8_2_ = auVar256._12_2_;
  auVar246._10_2_ = uStack_3ac;
  auVar246._12_2_ = auVar256._14_2_;
  auVar246._14_2_ = uStack_3aa;
  auVar228 = pmaddwd(auVar291,auVar176);
  auVar325 = pmaddwd(auVar246,auVar176);
  auVar70._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar70._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar70._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar70._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar19._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar19._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar19._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar19._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar71 = packssdw(auVar70,auVar19);
  auVar228 = pmaddwd(auVar291,auVar178);
  auVar325 = pmaddwd(auVar246,auVar178);
  auVar295._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar295._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar295._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar295._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar327._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar327._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar327._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar327._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar296 = packssdw(auVar295,auVar327);
  auVar228 = pmaddwd(auVar166,auVar176);
  auVar325 = pmaddwd(auVar103,auVar176);
  auVar329._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar329._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar329._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar329._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar360._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar360._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar360._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar360._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar330 = packssdw(auVar329,auVar360);
  auVar325 = pmaddwd(auVar166,auVar178);
  auVar228 = pmaddwd(auVar103,auVar178);
  auVar1._0_4_ = auVar325._0_4_ + 0x800 >> 0xc;
  auVar1._4_4_ = auVar325._4_4_ + 0x800 >> 0xc;
  auVar1._8_4_ = auVar325._8_4_ + 0x800 >> 0xc;
  auVar1._12_4_ = auVar325._12_4_ + 0x800 >> 0xc;
  auVar20._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar20._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar20._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar20._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar325 = packssdw(auVar1,auVar20);
  auVar215._8_4_ = 0xf138f9e1;
  auVar215._0_8_ = 0xf138f9e1f138f9e1;
  auVar215._12_4_ = 0xf138f9e1;
  auVar266 = pmaddwd(auVar104,auVar215);
  auVar228 = pmaddwd(auVar247,auVar215);
  auVar202._0_4_ = auVar266._0_4_ + 0x800 >> 0xc;
  auVar202._4_4_ = auVar266._4_4_ + 0x800 >> 0xc;
  auVar202._8_4_ = auVar266._8_4_ + 0x800 >> 0xc;
  auVar202._12_4_ = auVar266._12_4_ + 0x800 >> 0xc;
  auVar22._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar22._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar22._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar22._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar203 = packssdw(auVar202,auVar22);
  auVar228 = pmaddwd(auVar104,auVar176);
  auVar266 = pmaddwd(auVar247,auVar176);
  auVar121._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar121._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar121._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar121._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar21._0_4_ = auVar266._0_4_ + 0x800 >> 0xc;
  auVar21._4_4_ = auVar266._4_4_ + 0x800 >> 0xc;
  auVar21._8_4_ = auVar266._8_4_ + 0x800 >> 0xc;
  auVar21._12_4_ = auVar266._12_4_ + 0x800 >> 0xc;
  auVar228 = packssdw(auVar121,auVar21);
  auVar266 = paddsw(auVar256,auVar68);
  auVar72 = psubsw(auVar256,auVar68);
  local_398 = auVar132._0_2_;
  uStack_396 = auVar132._2_2_;
  uStack_394 = auVar132._4_2_;
  uStack_392 = auVar132._6_2_;
  uStack_390 = auVar132._8_2_;
  uStack_38e = auVar132._10_2_;
  uStack_38c = auVar132._12_2_;
  uStack_38a = auVar132._14_2_;
  auVar76._0_12_ = auVar68._0_12_;
  auVar76._12_2_ = auVar68._6_2_;
  auVar76._14_2_ = uStack_392;
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._0_10_ = auVar68._0_10_;
  auVar75._10_2_ = uStack_394;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._0_8_ = auVar68._0_8_;
  auVar74._8_2_ = auVar68._4_2_;
  auVar73._8_8_ = auVar74._8_8_;
  auVar73._6_2_ = uStack_396;
  auVar73._4_2_ = auVar68._2_2_;
  auVar73._0_2_ = auVar68._0_2_;
  auVar73._2_2_ = local_398;
  auVar2._2_2_ = uStack_390;
  auVar2._0_2_ = auVar68._8_2_;
  auVar2._4_2_ = auVar68._10_2_;
  auVar2._6_2_ = uStack_38e;
  auVar2._8_2_ = auVar68._12_2_;
  auVar2._10_2_ = uStack_38c;
  auVar2._12_2_ = auVar68._14_2_;
  auVar2._14_2_ = uStack_38a;
  auVar256 = pmaddwd(auVar73,auVar215);
  auVar68 = pmaddwd(auVar2,auVar215);
  auVar146._0_4_ = auVar256._0_4_ + 0x800 >> 0xc;
  auVar146._4_4_ = auVar256._4_4_ + 0x800 >> 0xc;
  auVar146._8_4_ = auVar256._8_4_ + 0x800 >> 0xc;
  auVar146._12_4_ = auVar256._12_4_ + 0x800 >> 0xc;
  auVar232._0_4_ = auVar68._0_4_ + 0x800 >> 0xc;
  auVar232._4_4_ = auVar68._4_4_ + 0x800 >> 0xc;
  auVar232._8_4_ = auVar68._8_4_ + 0x800 >> 0xc;
  auVar232._12_4_ = auVar68._12_4_ + 0x800 >> 0xc;
  auVar147 = packssdw(auVar146,auVar232);
  auVar68 = pmaddwd(auVar73,auVar176);
  auVar256 = pmaddwd(auVar2,auVar176);
  auVar77._0_4_ = auVar68._0_4_ + 0x800 >> 0xc;
  auVar77._4_4_ = auVar68._4_4_ + 0x800 >> 0xc;
  auVar77._8_4_ = auVar68._8_4_ + 0x800 >> 0xc;
  auVar77._12_4_ = auVar68._12_4_ + 0x800 >> 0xc;
  auVar3._0_4_ = auVar256._0_4_ + 0x800 >> 0xc;
  auVar3._4_4_ = auVar256._4_4_ + 0x800 >> 0xc;
  auVar3._8_4_ = auVar256._8_4_ + 0x800 >> 0xc;
  auVar3._12_4_ = auVar256._12_4_ + 0x800 >> 0xc;
  auVar78 = packssdw(auVar77,auVar3);
  auVar256 = paddsw(auVar243,auVar347);
  auVar347 = psubsw(auVar243,auVar347);
  auVar68 = paddsw(auVar268,auVar139);
  auVar269 = psubsw(auVar268,auVar139);
  auVar233 = psubsw(auVar230,auVar312);
  auVar230 = paddsw(auVar230,auVar312);
  auVar312 = psubsw(auVar201,auVar120);
  auVar120 = paddsw(auVar201,auVar120);
  auVar79 = paddsw(auVar344,auVar288);
  auVar243 = psubsw(auVar344,auVar288);
  auVar139 = paddsw(auVar63,auVar262);
  auVar262 = psubsw(auVar63,auVar262);
  auVar63 = paddsw(auVar145,auVar366);
  auVar268 = psubsw(auVar145,auVar366);
  auVar145 = paddsw(auVar17,auVar199);
  auVar288 = psubsw(auVar17,auVar199);
  auVar201 = psubsw(auVar307,auVar358);
  auVar188 = paddsw(auVar358,auVar307);
  auVar199 = psubsw(auVar212,auVar5);
  auVar191 = paddsw(auVar5,auVar212);
  auVar212 = psubsw(auVar254,auVar197);
  auVar246 = paddsw(auVar197,auVar254);
  auVar367 = psubsw(auVar113,auVar310);
  auVar327 = paddsw(auVar310,auVar113);
  auVar360 = paddsw(auVar7,auVar265);
  auVar1 = psubsw(auVar7,auVar265);
  local_178 = auVar110._0_2_;
  uStack_176 = auVar110._2_2_;
  uStack_174 = auVar110._4_2_;
  uStack_172 = auVar110._6_2_;
  uStack_170 = auVar110._8_2_;
  uStack_16e = auVar110._10_2_;
  uStack_16c = auVar110._12_2_;
  uStack_16a = auVar110._14_2_;
  auVar316._0_12_ = auVar265._0_12_;
  auVar316._12_2_ = auVar265._6_2_;
  auVar316._14_2_ = uStack_172;
  auVar315._12_4_ = auVar316._12_4_;
  auVar315._0_10_ = auVar265._0_10_;
  auVar315._10_2_ = uStack_174;
  auVar314._10_6_ = auVar315._10_6_;
  auVar314._0_8_ = auVar265._0_8_;
  auVar314._8_2_ = auVar265._4_2_;
  auVar313._8_8_ = auVar314._8_8_;
  auVar313._6_2_ = uStack_176;
  auVar313._4_2_ = auVar265._2_2_;
  auVar313._0_2_ = auVar265._0_2_;
  auVar313._2_2_ = local_178;
  auVar5._2_2_ = uStack_170;
  auVar5._0_2_ = auVar265._8_2_;
  auVar5._4_2_ = auVar265._10_2_;
  auVar5._6_2_ = uStack_16e;
  auVar5._8_2_ = auVar265._12_2_;
  auVar5._10_2_ = uStack_16c;
  auVar5._12_2_ = auVar265._14_2_;
  auVar5._14_2_ = uStack_16a;
  auVar80._8_4_ = 0xb50f4b0;
  auVar80._0_8_ = 0xb50f4b00b50f4b0;
  auVar80._12_4_ = 0xb50f4b0;
  auVar22 = pmaddwd(auVar313,auVar80);
  auVar121 = pmaddwd(auVar5,auVar80);
  auVar307._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar307._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar307._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar307._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar122._0_4_ = auVar121._0_4_ + 0x800 >> 0xc;
  auVar122._4_4_ = auVar121._4_4_ + 0x800 >> 0xc;
  auVar122._8_4_ = auVar121._8_4_ + 0x800 >> 0xc;
  auVar122._12_4_ = auVar121._12_4_ + 0x800 >> 0xc;
  auVar254 = packssdw(auVar307,auVar122);
  auVar81._8_4_ = 0xb500b50;
  auVar81._0_8_ = 0xb500b500b500b50;
  auVar81._12_4_ = 0xb500b50;
  auVar121 = pmaddwd(auVar313,auVar81);
  auVar22 = pmaddwd(auVar5,auVar81);
  auVar317._0_4_ = auVar121._0_4_ + 0x800 >> 0xc;
  auVar317._4_4_ = auVar121._4_4_ + 0x800 >> 0xc;
  auVar317._8_4_ = auVar121._8_4_ + 0x800 >> 0xc;
  auVar317._12_4_ = auVar121._12_4_ + 0x800 >> 0xc;
  auVar17._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar17._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar17._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar17._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar318 = packssdw(auVar317,auVar17);
  auVar121 = pmaddwd(auVar133,auVar80);
  auVar22 = pmaddwd(auVar108,auVar80);
  auVar123._0_4_ = auVar121._0_4_ + 0x800 >> 0xc;
  auVar123._4_4_ = auVar121._4_4_ + 0x800 >> 0xc;
  auVar123._8_4_ = auVar121._8_4_ + 0x800 >> 0xc;
  auVar123._12_4_ = auVar121._12_4_ + 0x800 >> 0xc;
  auVar113._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar113._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar113._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar113._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar366 = packssdw(auVar123,auVar113);
  auVar22 = pmaddwd(auVar133,auVar81);
  auVar121 = pmaddwd(auVar108,auVar81);
  auVar197._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar197._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar197._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar197._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar82._0_4_ = auVar121._0_4_ + 0x800 >> 0xc;
  auVar82._4_4_ = auVar121._4_4_ + 0x800 >> 0xc;
  auVar82._8_4_ = auVar121._8_4_ + 0x800 >> 0xc;
  auVar82._12_4_ = auVar121._12_4_ + 0x800 >> 0xc;
  auVar22 = packssdw(auVar197,auVar82);
  auVar121 = paddsw(auVar71,auVar147);
  auVar147 = psubsw(auVar71,auVar147);
  auVar2 = paddsw(auVar330,auVar203);
  auVar331 = psubsw(auVar330,auVar203);
  auVar310 = psubsw(auVar55,auVar130);
  auVar3 = paddsw(auVar130,auVar55);
  auVar130 = psubsw(auVar66,auVar132);
  auVar5 = paddsw(auVar132,auVar66);
  auVar132 = psubsw(auVar296,auVar78);
  auVar17 = paddsw(auVar78,auVar296);
  auVar182 = psubsw(auVar325,auVar228);
  auVar325 = paddsw(auVar228,auVar325);
  auVar151._0_12_ = auVar269._0_12_;
  auVar151._12_2_ = auVar269._6_2_;
  auVar151._14_2_ = auVar367._6_2_;
  auVar150._12_4_ = auVar151._12_4_;
  auVar150._0_10_ = auVar269._0_10_;
  auVar150._10_2_ = auVar367._4_2_;
  auVar149._10_6_ = auVar150._10_6_;
  auVar149._0_8_ = auVar269._0_8_;
  auVar149._8_2_ = auVar269._4_2_;
  auVar148._8_8_ = auVar149._8_8_;
  auVar148._6_2_ = auVar367._2_2_;
  auVar148._4_2_ = auVar269._2_2_;
  auVar148._0_2_ = auVar269._0_2_;
  auVar148._2_2_ = auVar367._0_2_;
  auVar270._2_2_ = auVar367._8_2_;
  auVar270._0_2_ = auVar269._8_2_;
  auVar270._4_2_ = auVar269._10_2_;
  auVar270._6_2_ = auVar367._10_2_;
  auVar270._8_2_ = auVar269._12_2_;
  auVar270._10_2_ = auVar367._12_2_;
  auVar270._12_2_ = auVar269._14_2_;
  auVar270._14_2_ = auVar367._14_2_;
  auVar113 = pmaddwd(auVar148,auVar176);
  auVar228 = pmaddwd(auVar270,auVar176);
  auVar344._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar344._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar344._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar344._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar55._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar55._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar55._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar55._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar203 = packssdw(auVar344,auVar55);
  auVar228 = pmaddwd(auVar148,auVar178);
  auVar113 = pmaddwd(auVar270,auVar178);
  auVar152._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar152._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar152._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar152._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar271._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar271._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar271._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar271._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar330 = packssdw(auVar152,auVar271);
  local_78 = auVar212._0_2_;
  uStack_76 = auVar212._2_2_;
  uStack_74 = auVar212._4_2_;
  uStack_72 = auVar212._6_2_;
  uStack_70 = auVar212._8_2_;
  uStack_6e = auVar212._10_2_;
  uStack_6c = auVar212._12_2_;
  uStack_6a = auVar212._14_2_;
  auVar275._0_12_ = auVar347._0_12_;
  auVar275._12_2_ = auVar347._6_2_;
  auVar275._14_2_ = uStack_72;
  auVar274._12_4_ = auVar275._12_4_;
  auVar274._0_10_ = auVar347._0_10_;
  auVar274._10_2_ = uStack_74;
  auVar273._10_6_ = auVar274._10_6_;
  auVar273._0_8_ = auVar347._0_8_;
  auVar273._8_2_ = auVar347._4_2_;
  auVar272._8_8_ = auVar273._8_8_;
  auVar272._6_2_ = uStack_76;
  auVar272._4_2_ = auVar347._2_2_;
  auVar272._0_2_ = auVar347._0_2_;
  auVar272._2_2_ = local_78;
  auVar153._2_2_ = uStack_70;
  auVar153._0_2_ = auVar347._8_2_;
  auVar153._4_2_ = auVar347._10_2_;
  auVar153._6_2_ = uStack_6e;
  auVar153._8_2_ = auVar347._12_2_;
  auVar153._10_2_ = uStack_6c;
  auVar153._12_2_ = auVar347._14_2_;
  auVar153._14_2_ = uStack_6a;
  auVar113 = pmaddwd(auVar272,auVar176);
  auVar228 = pmaddwd(auVar153,auVar176);
  auVar358._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar358._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar358._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar358._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar347._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar347._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar347._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar347._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar265 = packssdw(auVar358,auVar347);
  auVar113 = pmaddwd(auVar272,auVar178);
  auVar228 = pmaddwd(auVar153,auVar178);
  auVar276._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar276._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar276._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar276._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar154._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar154._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar154._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar154._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar277 = packssdw(auVar276,auVar154);
  local_68 = auVar199._0_2_;
  uStack_66 = auVar199._2_2_;
  uStack_64 = auVar199._4_2_;
  uStack_62 = auVar199._6_2_;
  uStack_60 = auVar199._8_2_;
  uStack_5e = auVar199._10_2_;
  uStack_5c = auVar199._12_2_;
  uStack_5a = auVar199._14_2_;
  auVar158._0_12_ = auVar328._0_12_;
  auVar158._12_2_ = auVar328._6_2_;
  auVar158._14_2_ = uStack_62;
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._0_10_ = auVar328._0_10_;
  auVar157._10_2_ = uStack_64;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._0_8_ = auVar328._0_8_;
  auVar156._8_2_ = auVar328._4_2_;
  auVar155._8_8_ = auVar156._8_8_;
  auVar155._6_2_ = uStack_66;
  auVar155._4_2_ = auVar328._2_2_;
  auVar155._0_2_ = auVar328._0_2_;
  auVar155._2_2_ = local_68;
  auVar23._2_2_ = uStack_60;
  auVar23._0_2_ = auVar328._8_2_;
  auVar23._4_2_ = auVar328._10_2_;
  auVar23._6_2_ = uStack_5e;
  auVar23._8_2_ = auVar328._12_2_;
  auVar23._10_2_ = uStack_5c;
  auVar23._12_2_ = auVar328._14_2_;
  auVar23._14_2_ = uStack_5a;
  auVar113 = pmaddwd(auVar155,auVar176);
  auVar228 = pmaddwd(auVar23,auVar176);
  auVar348._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar348._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar348._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar348._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar199._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar199._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar199._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar199._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar349 = packssdw(auVar348,auVar199);
  auVar113 = pmaddwd(auVar155,auVar178);
  auVar228 = pmaddwd(auVar23,auVar178);
  auVar159._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar159._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar159._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar159._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar24._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar24._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar24._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar24._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar328 = packssdw(auVar159,auVar24);
  local_58 = auVar201._0_2_;
  uStack_56 = auVar201._2_2_;
  uStack_54 = auVar201._4_2_;
  uStack_52 = auVar201._6_2_;
  uStack_50 = auVar201._8_2_;
  uStack_4e = auVar201._10_2_;
  uStack_4c = auVar201._12_2_;
  uStack_4a = auVar201._14_2_;
  auVar163._0_12_ = auVar189._0_12_;
  auVar163._12_2_ = auVar189._6_2_;
  auVar163._14_2_ = uStack_52;
  auVar162._12_4_ = auVar163._12_4_;
  auVar162._0_10_ = auVar189._0_10_;
  auVar162._10_2_ = uStack_54;
  auVar161._10_6_ = auVar162._10_6_;
  auVar161._0_8_ = auVar189._0_8_;
  auVar161._8_2_ = auVar189._4_2_;
  auVar160._8_8_ = auVar161._8_8_;
  auVar160._6_2_ = uStack_56;
  auVar160._4_2_ = auVar189._2_2_;
  auVar160._0_2_ = auVar189._0_2_;
  auVar160._2_2_ = local_58;
  auVar25._2_2_ = uStack_50;
  auVar25._0_2_ = auVar189._8_2_;
  auVar25._4_2_ = auVar189._10_2_;
  auVar25._6_2_ = uStack_4e;
  auVar25._8_2_ = auVar189._12_2_;
  auVar25._10_2_ = uStack_4c;
  auVar25._12_2_ = auVar189._14_2_;
  auVar25._14_2_ = uStack_4a;
  auVar113 = pmaddwd(auVar160,auVar178);
  auVar178 = pmaddwd(auVar25,auVar178);
  auVar197 = pmaddwd(auVar160,auVar176);
  auVar228 = pmaddwd(auVar25,auVar176);
  auVar297._0_4_ = auVar197._0_4_ + 0x800 >> 0xc;
  auVar297._4_4_ = auVar197._4_4_ + 0x800 >> 0xc;
  auVar297._8_4_ = auVar197._8_4_ + 0x800 >> 0xc;
  auVar297._12_4_ = auVar197._12_4_ + 0x800 >> 0xc;
  auVar201._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar201._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar201._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar201._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar298 = packssdw(auVar297,auVar201);
  auVar164._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar164._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar164._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar164._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar26._0_4_ = auVar178._0_4_ + 0x800 >> 0xc;
  auVar26._4_4_ = auVar178._4_4_ + 0x800 >> 0xc;
  auVar26._8_4_ = auVar178._8_4_ + 0x800 >> 0xc;
  auVar26._12_4_ = auVar178._12_4_ + 0x800 >> 0xc;
  auVar367 = packssdw(auVar164,auVar26);
  local_428 = auVar243._0_2_;
  uStack_426 = auVar243._2_2_;
  uStack_424 = auVar243._4_2_;
  uStack_422 = auVar243._6_2_;
  uStack_420 = auVar243._8_2_;
  uStack_41e = auVar243._10_2_;
  uStack_41c = auVar243._12_2_;
  uStack_41a = auVar243._14_2_;
  auVar86._0_12_ = auVar205._0_12_;
  auVar86._12_2_ = auVar205._6_2_;
  auVar86._14_2_ = uStack_422;
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._0_10_ = auVar205._0_10_;
  auVar85._10_2_ = uStack_424;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._0_8_ = auVar205._0_8_;
  auVar84._8_2_ = auVar205._4_2_;
  auVar83._8_8_ = auVar84._8_8_;
  auVar83._6_2_ = uStack_426;
  auVar83._4_2_ = auVar205._2_2_;
  auVar83._0_2_ = auVar205._0_2_;
  auVar83._2_2_ = local_428;
  auVar27._2_2_ = uStack_420;
  auVar27._0_2_ = auVar205._8_2_;
  auVar27._4_2_ = auVar205._10_2_;
  auVar27._6_2_ = uStack_41e;
  auVar27._8_2_ = auVar205._12_2_;
  auVar27._10_2_ = uStack_41c;
  auVar27._12_2_ = auVar205._14_2_;
  auVar27._14_2_ = uStack_41a;
  auVar228 = pmaddwd(auVar83,auVar215);
  auVar205 = pmaddwd(auVar27,auVar215);
  auVar165._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar165._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar165._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar165._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar212._0_4_ = auVar205._0_4_ + 0x800 >> 0xc;
  auVar212._4_4_ = auVar205._4_4_ + 0x800 >> 0xc;
  auVar212._8_4_ = auVar205._8_4_ + 0x800 >> 0xc;
  auVar212._12_4_ = auVar205._12_4_ + 0x800 >> 0xc;
  auVar166 = packssdw(auVar165,auVar212);
  auVar228 = pmaddwd(auVar83,auVar176);
  auVar205 = pmaddwd(auVar27,auVar176);
  auVar87._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar87._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar87._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar87._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar28._0_4_ = auVar205._0_4_ + 0x800 >> 0xc;
  auVar28._4_4_ = auVar205._4_4_ + 0x800 >> 0xc;
  auVar28._8_4_ = auVar205._8_4_ + 0x800 >> 0xc;
  auVar28._12_4_ = auVar205._12_4_ + 0x800 >> 0xc;
  auVar269 = packssdw(auVar87,auVar28);
  local_488 = auVar262._0_2_;
  uStack_486 = auVar262._2_2_;
  uStack_484 = auVar262._4_2_;
  uStack_482 = auVar262._6_2_;
  uStack_480 = auVar262._8_2_;
  uStack_47e = auVar262._10_2_;
  uStack_47c = auVar262._12_2_;
  uStack_47a = auVar262._14_2_;
  auVar32._0_12_ = auVar206._0_12_;
  auVar32._12_2_ = auVar206._6_2_;
  auVar32._14_2_ = uStack_482;
  auVar31._12_4_ = auVar32._12_4_;
  auVar31._0_10_ = auVar206._0_10_;
  auVar31._10_2_ = uStack_484;
  auVar30._10_6_ = auVar31._10_6_;
  auVar30._0_8_ = auVar206._0_8_;
  auVar30._8_2_ = auVar206._4_2_;
  auVar29._8_8_ = auVar30._8_8_;
  auVar29._6_2_ = uStack_486;
  auVar29._4_2_ = auVar206._2_2_;
  auVar29._0_2_ = auVar206._0_2_;
  auVar29._2_2_ = local_488;
  auVar278._2_2_ = uStack_480;
  auVar278._0_2_ = auVar206._8_2_;
  auVar278._4_2_ = auVar206._10_2_;
  auVar278._6_2_ = uStack_47e;
  auVar278._8_2_ = auVar206._12_2_;
  auVar278._10_2_ = uStack_47c;
  auVar278._12_2_ = auVar206._14_2_;
  auVar278._14_2_ = uStack_47a;
  auVar206 = pmaddwd(auVar29,auVar215);
  auVar205 = pmaddwd(auVar278,auVar215);
  auVar88._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar88._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar88._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar88._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar262._0_4_ = auVar205._0_4_ + 0x800 >> 0xc;
  auVar262._4_4_ = auVar205._4_4_ + 0x800 >> 0xc;
  auVar262._8_4_ = auVar205._8_4_ + 0x800 >> 0xc;
  auVar262._12_4_ = auVar205._12_4_ + 0x800 >> 0xc;
  auVar296 = packssdw(auVar88,auVar262);
  auVar205 = pmaddwd(auVar29,auVar176);
  auVar206 = pmaddwd(auVar278,auVar176);
  auVar33._0_4_ = auVar205._0_4_ + 0x800 >> 0xc;
  auVar33._4_4_ = auVar205._4_4_ + 0x800 >> 0xc;
  auVar33._8_4_ = auVar205._8_4_ + 0x800 >> 0xc;
  auVar33._12_4_ = auVar205._12_4_ + 0x800 >> 0xc;
  auVar279._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar279._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar279._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar279._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar189 = packssdw(auVar33,auVar279);
  local_478 = auVar268._0_2_;
  uStack_476 = auVar268._2_2_;
  uStack_474 = auVar268._4_2_;
  uStack_472 = auVar268._6_2_;
  uStack_470 = auVar268._8_2_;
  uStack_46e = auVar268._10_2_;
  uStack_46c = auVar268._12_2_;
  uStack_46a = auVar268._14_2_;
  auVar37._0_12_ = auVar233._0_12_;
  auVar37._12_2_ = auVar233._6_2_;
  auVar37._14_2_ = uStack_472;
  auVar36._12_4_ = auVar37._12_4_;
  auVar36._0_10_ = auVar233._0_10_;
  auVar36._10_2_ = uStack_474;
  auVar35._10_6_ = auVar36._10_6_;
  auVar35._0_8_ = auVar233._0_8_;
  auVar35._8_2_ = auVar233._4_2_;
  auVar34._8_8_ = auVar35._8_8_;
  auVar34._6_2_ = uStack_476;
  auVar34._4_2_ = auVar233._2_2_;
  auVar34._0_2_ = auVar233._0_2_;
  auVar34._2_2_ = local_478;
  auVar234._2_2_ = uStack_470;
  auVar234._0_2_ = auVar233._8_2_;
  auVar234._4_2_ = auVar233._10_2_;
  auVar234._6_2_ = uStack_46e;
  auVar234._8_2_ = auVar233._12_2_;
  auVar234._10_2_ = uStack_46c;
  auVar234._12_2_ = auVar233._14_2_;
  auVar234._14_2_ = uStack_46a;
  auVar206 = pmaddwd(auVar34,auVar215);
  auVar205 = pmaddwd(auVar234,auVar215);
  auVar167._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar167._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar167._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar167._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar268._0_4_ = auVar205._0_4_ + 0x800 >> 0xc;
  auVar268._4_4_ = auVar205._4_4_ + 0x800 >> 0xc;
  auVar268._8_4_ = auVar205._8_4_ + 0x800 >> 0xc;
  auVar268._12_4_ = auVar205._12_4_ + 0x800 >> 0xc;
  auVar233 = packssdw(auVar167,auVar268);
  auVar205 = pmaddwd(auVar34,auVar176);
  auVar206 = pmaddwd(auVar234,auVar176);
  auVar38._0_4_ = auVar205._0_4_ + 0x800 >> 0xc;
  auVar38._4_4_ = auVar205._4_4_ + 0x800 >> 0xc;
  auVar38._8_4_ = auVar205._8_4_ + 0x800 >> 0xc;
  auVar38._12_4_ = auVar205._12_4_ + 0x800 >> 0xc;
  auVar235._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar235._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar235._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar235._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar268 = packssdw(auVar38,auVar235);
  local_498 = auVar288._0_2_;
  uStack_496 = auVar288._2_2_;
  uStack_494 = auVar288._4_2_;
  uStack_492 = auVar288._6_2_;
  uStack_490 = auVar288._8_2_;
  uStack_48e = auVar288._10_2_;
  uStack_48c = auVar288._12_2_;
  uStack_48a = auVar288._14_2_;
  auVar66._0_12_ = auVar312._0_12_;
  auVar66._12_2_ = auVar312._6_2_;
  auVar66._14_2_ = uStack_492;
  auVar71._12_4_ = auVar66._12_4_;
  auVar71._0_10_ = auVar312._0_10_;
  auVar71._10_2_ = uStack_494;
  auVar78._10_6_ = auVar71._10_6_;
  auVar78._0_8_ = auVar312._0_8_;
  auVar78._8_2_ = auVar312._4_2_;
  auVar288._8_8_ = auVar78._8_8_;
  auVar288._6_2_ = uStack_496;
  auVar288._4_2_ = auVar312._2_2_;
  auVar288._0_2_ = auVar312._0_2_;
  auVar288._2_2_ = local_498;
  auVar39._2_2_ = uStack_490;
  auVar39._0_2_ = auVar312._8_2_;
  auVar39._4_2_ = auVar312._10_2_;
  auVar39._6_2_ = uStack_48e;
  auVar39._8_2_ = auVar312._12_2_;
  auVar39._10_2_ = uStack_48c;
  auVar39._12_2_ = auVar312._14_2_;
  auVar39._14_2_ = uStack_48a;
  auVar243 = pmaddwd(auVar288,auVar215);
  auVar228 = pmaddwd(auVar215,auVar39);
  auVar205 = pmaddwd(auVar288,auVar176);
  auVar206 = pmaddwd(auVar39,auVar176);
  auVar280._0_4_ = auVar243._0_4_ + 0x800 >> 0xc;
  auVar280._4_4_ = auVar243._4_4_ + 0x800 >> 0xc;
  auVar280._8_4_ = auVar243._8_4_ + 0x800 >> 0xc;
  auVar280._12_4_ = auVar243._12_4_ + 0x800 >> 0xc;
  auVar216._0_4_ = auVar228._0_4_ + 0x800 >> 0xc;
  auVar216._4_4_ = auVar228._4_4_ + 0x800 >> 0xc;
  auVar216._8_4_ = auVar228._8_4_ + 0x800 >> 0xc;
  auVar216._12_4_ = auVar228._12_4_ + 0x800 >> 0xc;
  auVar281 = packssdw(auVar280,auVar216);
  auVar312._0_4_ = auVar205._0_4_ + 0x800 >> 0xc;
  auVar312._4_4_ = auVar205._4_4_ + 0x800 >> 0xc;
  auVar312._8_4_ = auVar205._8_4_ + 0x800 >> 0xc;
  auVar312._12_4_ = auVar205._12_4_ + 0x800 >> 0xc;
  auVar40._0_4_ = auVar206._0_4_ + 0x800 >> 0xc;
  auVar40._4_4_ = auVar206._4_4_ + 0x800 >> 0xc;
  auVar40._8_4_ = auVar206._8_4_ + 0x800 >> 0xc;
  auVar40._12_4_ = auVar206._12_4_ + 0x800 >> 0xc;
  auVar205 = packssdw(auVar312,auVar40);
  auVar206 = paddsw(auVar7,auVar57);
  auVar228 = psubsw(auVar7,auVar57);
  auVar243 = paddsw(auVar7,auVar110);
  auVar176 = psubsw(auVar7,auVar110);
  auVar178 = paddsw(auVar7,auVar318);
  auVar113 = psubsw(auVar7,auVar318);
  auVar197 = paddsw(auVar7,auVar22);
  auVar22 = psubsw(auVar7,auVar22);
  auVar55 = paddsw(auVar7,auVar366);
  auVar347 = psubsw(auVar7,auVar366);
  auVar199 = paddsw(auVar7,auVar254);
  auVar201 = psubsw(auVar7,auVar254);
  auVar171._0_12_ = auVar331._0_12_;
  auVar171._12_2_ = auVar331._6_2_;
  auVar171._14_2_ = auVar182._6_2_;
  auVar170._12_4_ = auVar171._12_4_;
  auVar170._0_10_ = auVar331._0_10_;
  auVar170._10_2_ = auVar182._4_2_;
  auVar169._10_6_ = auVar170._10_6_;
  auVar169._0_8_ = auVar331._0_8_;
  auVar169._8_2_ = auVar331._4_2_;
  auVar168._8_8_ = auVar169._8_8_;
  auVar168._6_2_ = auVar182._2_2_;
  auVar168._4_2_ = auVar331._2_2_;
  auVar168._0_2_ = auVar331._0_2_;
  auVar168._2_2_ = auVar182._0_2_;
  auVar332._2_2_ = auVar182._8_2_;
  auVar332._0_2_ = auVar331._8_2_;
  auVar332._4_2_ = auVar331._10_2_;
  auVar332._6_2_ = auVar182._10_2_;
  auVar332._8_2_ = auVar331._12_2_;
  auVar332._10_2_ = auVar182._12_2_;
  auVar332._12_2_ = auVar331._14_2_;
  auVar332._14_2_ = auVar182._14_2_;
  auVar262 = pmaddwd(auVar168,auVar80);
  auVar212 = pmaddwd(auVar332,auVar80);
  auVar41._0_4_ = auVar262._0_4_ + 0x800 >> 0xc;
  auVar41._4_4_ = auVar262._4_4_ + 0x800 >> 0xc;
  auVar41._8_4_ = auVar262._8_4_ + 0x800 >> 0xc;
  auVar41._12_4_ = auVar262._12_4_ + 0x800 >> 0xc;
  auVar7._0_4_ = auVar212._0_4_ + 0x800 >> 0xc;
  auVar7._4_4_ = auVar212._4_4_ + 0x800 >> 0xc;
  auVar7._8_4_ = auVar212._8_4_ + 0x800 >> 0xc;
  auVar7._12_4_ = auVar212._12_4_ + 0x800 >> 0xc;
  auVar288 = packssdw(auVar41,auVar7);
  auVar212 = pmaddwd(auVar168,auVar81);
  auVar262 = pmaddwd(auVar332,auVar81);
  auVar172._0_4_ = auVar212._0_4_ + 0x800 >> 0xc;
  auVar172._4_4_ = auVar212._4_4_ + 0x800 >> 0xc;
  auVar172._8_4_ = auVar212._8_4_ + 0x800 >> 0xc;
  auVar172._12_4_ = auVar212._12_4_ + 0x800 >> 0xc;
  auVar333._0_4_ = auVar262._0_4_ + 0x800 >> 0xc;
  auVar333._4_4_ = auVar262._4_4_ + 0x800 >> 0xc;
  auVar333._8_4_ = auVar262._8_4_ + 0x800 >> 0xc;
  auVar333._12_4_ = auVar262._12_4_ + 0x800 >> 0xc;
  auVar110 = packssdw(auVar172,auVar333);
  local_48 = auVar132._0_2_;
  uStack_46 = auVar132._2_2_;
  uStack_44 = auVar132._4_2_;
  uStack_42 = auVar132._6_2_;
  uStack_40 = auVar132._8_2_;
  uStack_3e = auVar132._10_2_;
  uStack_3c = auVar132._12_2_;
  uStack_3a = auVar132._14_2_;
  auVar322._0_12_ = auVar147._0_12_;
  auVar322._12_2_ = auVar147._6_2_;
  auVar322._14_2_ = uStack_42;
  auVar321._12_4_ = auVar322._12_4_;
  auVar321._0_10_ = auVar147._0_10_;
  auVar321._10_2_ = uStack_44;
  auVar320._10_6_ = auVar321._10_6_;
  auVar320._0_8_ = auVar147._0_8_;
  auVar320._8_2_ = auVar147._4_2_;
  auVar319._8_8_ = auVar320._8_8_;
  auVar319._6_2_ = uStack_46;
  auVar319._4_2_ = auVar147._2_2_;
  auVar319._0_2_ = auVar147._0_2_;
  auVar319._2_2_ = local_48;
  auVar89._2_2_ = uStack_40;
  auVar89._0_2_ = auVar147._8_2_;
  auVar89._4_2_ = auVar147._10_2_;
  auVar89._6_2_ = uStack_3e;
  auVar89._8_2_ = auVar147._12_2_;
  auVar89._10_2_ = uStack_3c;
  auVar89._12_2_ = auVar147._14_2_;
  auVar89._14_2_ = uStack_3a;
  auVar262 = pmaddwd(auVar319,auVar80);
  auVar212 = pmaddwd(auVar89,auVar80);
  auVar368._0_4_ = auVar262._0_4_ + 0x800 >> 0xc;
  auVar368._4_4_ = auVar262._4_4_ + 0x800 >> 0xc;
  auVar368._8_4_ = auVar262._8_4_ + 0x800 >> 0xc;
  auVar368._12_4_ = auVar262._12_4_ + 0x800 >> 0xc;
  auVar254._0_4_ = auVar212._0_4_ + 0x800 >> 0xc;
  auVar254._4_4_ = auVar212._4_4_ + 0x800 >> 0xc;
  auVar254._8_4_ = auVar212._8_4_ + 0x800 >> 0xc;
  auVar254._12_4_ = auVar212._12_4_ + 0x800 >> 0xc;
  auVar369 = packssdw(auVar368,auVar254);
  auVar262 = pmaddwd(auVar319,auVar81);
  auVar212 = pmaddwd(auVar89,auVar81);
  auVar323._0_4_ = auVar262._0_4_ + 0x800 >> 0xc;
  auVar323._4_4_ = auVar262._4_4_ + 0x800 >> 0xc;
  auVar323._8_4_ = auVar262._8_4_ + 0x800 >> 0xc;
  auVar323._12_4_ = auVar262._12_4_ + 0x800 >> 0xc;
  auVar90._0_4_ = auVar212._0_4_ + 0x800 >> 0xc;
  auVar90._4_4_ = auVar212._4_4_ + 0x800 >> 0xc;
  auVar90._8_4_ = auVar212._8_4_ + 0x800 >> 0xc;
  auVar90._12_4_ = auVar212._12_4_ + 0x800 >> 0xc;
  auVar318 = packssdw(auVar323,auVar90);
  local_358 = auVar130._0_2_;
  uStack_356 = auVar130._2_2_;
  uStack_354 = auVar130._4_2_;
  uStack_352 = auVar130._6_2_;
  uStack_350 = auVar130._8_2_;
  uStack_34e = auVar130._10_2_;
  uStack_34c = auVar130._12_2_;
  uStack_34a = auVar130._14_2_;
  auVar127._0_12_ = auVar72._0_12_;
  auVar127._12_2_ = auVar72._6_2_;
  auVar127._14_2_ = uStack_352;
  auVar126._12_4_ = auVar127._12_4_;
  auVar126._0_10_ = auVar72._0_10_;
  auVar126._10_2_ = uStack_354;
  auVar125._10_6_ = auVar126._10_6_;
  auVar125._0_8_ = auVar72._0_8_;
  auVar125._8_2_ = auVar72._4_2_;
  auVar124._8_8_ = auVar125._8_8_;
  auVar124._6_2_ = uStack_356;
  auVar124._4_2_ = auVar72._2_2_;
  auVar124._0_2_ = auVar72._0_2_;
  auVar124._2_2_ = local_358;
  auVar183._2_2_ = uStack_350;
  auVar183._0_2_ = auVar72._8_2_;
  auVar183._4_2_ = auVar72._10_2_;
  auVar183._6_2_ = uStack_34e;
  auVar183._8_2_ = auVar72._12_2_;
  auVar183._10_2_ = uStack_34c;
  auVar183._12_2_ = auVar72._14_2_;
  auVar183._14_2_ = uStack_34a;
  auVar262 = pmaddwd(auVar124,auVar80);
  auVar212 = pmaddwd(auVar183,auVar80);
  auVar236._0_4_ = auVar262._0_4_ + 0x800 >> 0xc;
  auVar236._4_4_ = auVar262._4_4_ + 0x800 >> 0xc;
  auVar236._8_4_ = auVar262._8_4_ + 0x800 >> 0xc;
  auVar236._12_4_ = auVar262._12_4_ + 0x800 >> 0xc;
  auVar147._0_4_ = auVar212._0_4_ + 0x800 >> 0xc;
  auVar147._4_4_ = auVar212._4_4_ + 0x800 >> 0xc;
  auVar147._8_4_ = auVar212._8_4_ + 0x800 >> 0xc;
  auVar147._12_4_ = auVar212._12_4_ + 0x800 >> 0xc;
  auVar366 = packssdw(auVar236,auVar147);
  auVar212 = pmaddwd(auVar124,auVar81);
  auVar262 = pmaddwd(auVar183,auVar81);
  auVar128._0_4_ = auVar212._0_4_ + 0x800 >> 0xc;
  auVar128._4_4_ = auVar212._4_4_ + 0x800 >> 0xc;
  auVar128._8_4_ = auVar212._8_4_ + 0x800 >> 0xc;
  auVar128._12_4_ = auVar212._12_4_ + 0x800 >> 0xc;
  auVar184._0_4_ = auVar262._0_4_ + 0x800 >> 0xc;
  auVar184._4_4_ = auVar262._4_4_ + 0x800 >> 0xc;
  auVar184._8_4_ = auVar262._8_4_ + 0x800 >> 0xc;
  auVar184._12_4_ = auVar262._12_4_ + 0x800 >> 0xc;
  auVar57 = packssdw(auVar128,auVar184);
  local_348 = auVar310._0_2_;
  uStack_346 = auVar310._2_2_;
  uStack_344 = auVar310._4_2_;
  uStack_342 = auVar310._6_2_;
  uStack_340 = auVar310._8_2_;
  uStack_33e = auVar310._10_2_;
  uStack_33c = auVar310._12_2_;
  uStack_33a = auVar310._14_2_;
  auVar220._0_12_ = auVar263._0_12_;
  auVar220._12_2_ = auVar263._6_2_;
  auVar220._14_2_ = uStack_342;
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._0_10_ = auVar263._0_10_;
  auVar219._10_2_ = uStack_344;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._0_8_ = auVar263._0_8_;
  auVar218._8_2_ = auVar263._4_2_;
  auVar217._8_8_ = auVar218._8_8_;
  auVar217._6_2_ = uStack_346;
  auVar217._4_2_ = auVar263._2_2_;
  auVar217._0_2_ = auVar263._0_2_;
  auVar217._2_2_ = local_348;
  auVar334._2_2_ = uStack_340;
  auVar334._0_2_ = auVar263._8_2_;
  auVar334._4_2_ = auVar263._10_2_;
  auVar334._6_2_ = uStack_33e;
  auVar334._8_2_ = auVar263._12_2_;
  auVar334._10_2_ = uStack_33c;
  auVar334._12_2_ = auVar263._14_2_;
  auVar334._14_2_ = uStack_33a;
  auVar212 = pmaddwd(auVar217,auVar80);
  auVar262 = pmaddwd(auVar334,auVar80);
  auVar91._0_4_ = auVar212._0_4_ + 0x800 >> 0xc;
  auVar91._4_4_ = auVar212._4_4_ + 0x800 >> 0xc;
  auVar91._8_4_ = auVar212._8_4_ + 0x800 >> 0xc;
  auVar91._12_4_ = auVar212._12_4_ + 0x800 >> 0xc;
  auVar185._0_4_ = auVar262._0_4_ + 0x800 >> 0xc;
  auVar185._4_4_ = auVar262._4_4_ + 0x800 >> 0xc;
  auVar185._8_4_ = auVar262._8_4_ + 0x800 >> 0xc;
  auVar185._12_4_ = auVar262._12_4_ + 0x800 >> 0xc;
  auVar132 = packssdw(auVar91,auVar185);
  auVar212 = pmaddwd(auVar217,auVar81);
  auVar262 = pmaddwd(auVar334,auVar81);
  auVar221._0_4_ = auVar212._0_4_ + 0x800 >> 0xc;
  auVar221._4_4_ = auVar212._4_4_ + 0x800 >> 0xc;
  auVar221._8_4_ = auVar212._8_4_ + 0x800 >> 0xc;
  auVar221._12_4_ = auVar212._12_4_ + 0x800 >> 0xc;
  auVar335._0_4_ = auVar262._0_4_ + 0x800 >> 0xc;
  auVar335._4_4_ = auVar262._4_4_ + 0x800 >> 0xc;
  auVar335._8_4_ = auVar262._8_4_ + 0x800 >> 0xc;
  auVar335._12_4_ = auVar262._12_4_ + 0x800 >> 0xc;
  auVar72 = packssdw(auVar221,auVar335);
  auVar331 = paddsw(auVar4,auVar244);
  auVar212 = psubsw(auVar4,auVar244);
  auVar336 = paddsw(auVar115,auVar11);
  auVar66 = psubsw(auVar115,auVar11);
  auVar337 = paddsw(auVar256,auVar230);
  auVar71 = psubsw(auVar256,auVar230);
  auVar256 = paddsw(auVar68,auVar120);
  auVar78 = psubsw(auVar68,auVar120);
  auVar68 = paddsw(auVar203,auVar281);
  auVar312 = psubsw(auVar203,auVar281);
  auVar230 = paddsw(auVar265,auVar233);
  auVar11 = psubsw(auVar265,auVar233);
  auVar120 = paddsw(auVar349,auVar296);
  auVar349 = psubsw(auVar349,auVar296);
  auVar262 = paddsw(auVar298,auVar166);
  auVar281 = psubsw(auVar298,auVar166);
  auVar7 = psubsw(auVar188,auVar79);
  auVar166 = paddsw(auVar188,auVar79);
  auVar254 = psubsw(auVar191,auVar139);
  auVar233 = paddsw(auVar191,auVar139);
  auVar147 = psubsw(auVar246,auVar63);
  auVar182 = paddsw(auVar246,auVar63);
  auVar130 = psubsw(auVar327,auVar145);
  auVar263 = paddsw(auVar327,auVar145);
  auVar203 = psubsw(auVar330,auVar205);
  auVar205 = paddsw(auVar205,auVar330);
  auVar265 = psubsw(auVar277,auVar268);
  auVar139 = paddsw(auVar268,auVar277);
  auVar277 = psubsw(auVar328,auVar189);
  auVar63 = paddsw(auVar189,auVar328);
  auVar4 = psubsw(auVar367,auVar269);
  auVar145 = paddsw(auVar269,auVar367);
  auVar268 = paddsw(auVar206,auVar3);
  auVar206 = psubsw(auVar206,auVar3);
  auVar79 = paddsw(auVar243,auVar5);
  auVar243 = psubsw(auVar243,auVar5);
  auVar310 = paddsw(auVar178,auVar17);
  auVar178 = psubsw(auVar178,auVar17);
  auVar17 = paddsw(auVar197,auVar325);
  auVar325 = psubsw(auVar197,auVar325);
  auVar367 = paddsw(auVar55,auVar110);
  auVar188 = psubsw(auVar55,auVar110);
  auVar197 = paddsw(auVar199,auVar318);
  auVar191 = psubsw(auVar199,auVar318);
  auVar55 = paddsw(auVar360,auVar57);
  auVar246 = psubsw(auVar360,auVar57);
  auVar199 = paddsw(auVar248,auVar72);
  auVar327 = psubsw(auVar248,auVar72);
  auVar269 = paddsw(auVar8,auVar132);
  auVar360 = psubsw(auVar8,auVar132);
  auVar296 = paddsw(auVar1,auVar366);
  auVar1 = psubsw(auVar1,auVar366);
  auVar115 = paddsw(auVar201,auVar369);
  auVar3 = psubsw(auVar201,auVar369);
  auVar201 = paddsw(auVar347,auVar288);
  auVar5 = psubsw(auVar347,auVar288);
  auVar288 = paddsw(auVar22,auVar2);
  auVar22 = psubsw(auVar22,auVar2);
  auVar110 = paddsw(auVar113,auVar121);
  auVar121 = psubsw(auVar113,auVar121);
  auVar366 = paddsw(auVar176,auVar266);
  auVar266 = psubsw(auVar176,auVar266);
  auVar330 = paddsw(auVar228,auVar6);
  auVar228 = psubsw(auVar228,auVar6);
  auVar225._0_12_ = auVar281._0_12_;
  auVar225._12_2_ = auVar281._6_2_;
  auVar225._14_2_ = auVar4._6_2_;
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._0_10_ = auVar281._0_10_;
  auVar224._10_2_ = auVar4._4_2_;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._0_8_ = auVar281._0_8_;
  auVar223._8_2_ = auVar281._4_2_;
  auVar222._8_8_ = auVar223._8_8_;
  auVar222._6_2_ = auVar4._2_2_;
  auVar222._4_2_ = auVar281._2_2_;
  auVar222._0_2_ = auVar281._0_2_;
  auVar222._2_2_ = auVar4._0_2_;
  auVar299._2_2_ = auVar4._8_2_;
  auVar299._0_2_ = auVar281._8_2_;
  auVar299._4_2_ = auVar281._10_2_;
  auVar299._6_2_ = auVar4._10_2_;
  auVar299._8_2_ = auVar281._12_2_;
  auVar299._10_2_ = auVar4._12_2_;
  auVar299._12_2_ = auVar281._14_2_;
  auVar299._14_2_ = auVar4._14_2_;
  auVar2 = pmaddwd(auVar222,auVar80);
  auVar176 = pmaddwd(auVar299,auVar80);
  auVar244._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar244._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar244._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar244._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar4._0_4_ = auVar176._0_4_ + 0x800 >> 0xc;
  auVar4._4_4_ = auVar176._4_4_ + 0x800 >> 0xc;
  auVar4._8_4_ = auVar176._8_4_ + 0x800 >> 0xc;
  auVar4._12_4_ = auVar176._12_4_ + 0x800 >> 0xc;
  auVar2 = packssdw(auVar244,auVar4);
  auVar176 = pmaddwd(auVar222,auVar81);
  auVar113 = pmaddwd(auVar299,auVar81);
  auVar226._0_4_ = auVar176._0_4_ + 0x800 >> 0xc;
  auVar226._4_4_ = auVar176._4_4_ + 0x800 >> 0xc;
  auVar226._8_4_ = auVar176._8_4_ + 0x800 >> 0xc;
  auVar226._12_4_ = auVar176._12_4_ + 0x800 >> 0xc;
  auVar300._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar300._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar300._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar300._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar328 = packssdw(auVar226,auVar300);
  auVar341._0_12_ = auVar349._0_12_;
  auVar341._12_2_ = auVar349._6_2_;
  auVar341._14_2_ = auVar277._6_2_;
  auVar340._12_4_ = auVar341._12_4_;
  auVar340._0_10_ = auVar349._0_10_;
  auVar340._10_2_ = auVar277._4_2_;
  auVar339._10_6_ = auVar340._10_6_;
  auVar339._0_8_ = auVar349._0_8_;
  auVar339._8_2_ = auVar349._4_2_;
  auVar338._8_8_ = auVar339._8_8_;
  auVar338._6_2_ = auVar277._2_2_;
  auVar338._4_2_ = auVar349._2_2_;
  auVar338._0_2_ = auVar349._0_2_;
  auVar338._2_2_ = auVar277._0_2_;
  auVar350._2_2_ = auVar277._8_2_;
  auVar350._0_2_ = auVar349._8_2_;
  auVar350._4_2_ = auVar349._10_2_;
  auVar350._6_2_ = auVar277._10_2_;
  auVar350._8_2_ = auVar349._12_2_;
  auVar350._10_2_ = auVar277._12_2_;
  auVar350._12_2_ = auVar349._14_2_;
  auVar350._14_2_ = auVar277._14_2_;
  auVar113 = pmaddwd(auVar338,auVar80);
  auVar176 = pmaddwd(auVar350,auVar80);
  auVar42._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar42._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar42._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar42._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar6._0_4_ = auVar176._0_4_ + 0x800 >> 0xc;
  auVar6._4_4_ = auVar176._4_4_ + 0x800 >> 0xc;
  auVar6._8_4_ = auVar176._8_4_ + 0x800 >> 0xc;
  auVar6._12_4_ = auVar176._12_4_ + 0x800 >> 0xc;
  auVar113 = packssdw(auVar42,auVar6);
  auVar176 = pmaddwd(auVar338,auVar81);
  auVar347 = pmaddwd(auVar350,auVar81);
  auVar342._0_4_ = auVar176._0_4_ + 0x800 >> 0xc;
  auVar342._4_4_ = auVar176._4_4_ + 0x800 >> 0xc;
  auVar342._8_4_ = auVar176._8_4_ + 0x800 >> 0xc;
  auVar342._12_4_ = auVar176._12_4_ + 0x800 >> 0xc;
  auVar351._0_4_ = auVar347._0_4_ + 0x800 >> 0xc;
  auVar351._4_4_ = auVar347._4_4_ + 0x800 >> 0xc;
  auVar351._8_4_ = auVar347._8_4_ + 0x800 >> 0xc;
  auVar351._12_4_ = auVar347._12_4_ + 0x800 >> 0xc;
  auVar248 = packssdw(auVar342,auVar351);
  local_158 = auVar265._0_2_;
  uStack_156 = auVar265._2_2_;
  uStack_154 = auVar265._4_2_;
  uStack_152 = auVar265._6_2_;
  uStack_150 = auVar265._8_2_;
  uStack_14e = auVar265._10_2_;
  uStack_14c = auVar265._12_2_;
  uStack_14a = auVar265._14_2_;
  auVar240._0_12_ = auVar11._0_12_;
  auVar240._12_2_ = auVar11._6_2_;
  auVar240._14_2_ = uStack_152;
  auVar239._12_4_ = auVar240._12_4_;
  auVar239._0_10_ = auVar11._0_10_;
  auVar239._10_2_ = uStack_154;
  auVar238._10_6_ = auVar239._10_6_;
  auVar238._0_8_ = auVar11._0_8_;
  auVar238._8_2_ = auVar11._4_2_;
  auVar237._8_8_ = auVar238._8_8_;
  auVar237._6_2_ = uStack_156;
  auVar237._4_2_ = auVar11._2_2_;
  auVar237._0_2_ = auVar11._0_2_;
  auVar237._2_2_ = local_158;
  auVar43._2_2_ = uStack_150;
  auVar43._0_2_ = auVar11._8_2_;
  auVar43._4_2_ = auVar11._10_2_;
  auVar43._6_2_ = uStack_14e;
  auVar43._8_2_ = auVar11._12_2_;
  auVar43._10_2_ = uStack_14c;
  auVar43._12_2_ = auVar11._14_2_;
  auVar43._14_2_ = uStack_14a;
  auVar347 = pmaddwd(auVar237,auVar80);
  auVar176 = pmaddwd(auVar43,auVar80);
  auVar92._0_4_ = auVar347._0_4_ + 0x800 >> 0xc;
  auVar92._4_4_ = auVar347._4_4_ + 0x800 >> 0xc;
  auVar92._8_4_ = auVar347._8_4_ + 0x800 >> 0xc;
  auVar92._12_4_ = auVar347._12_4_ + 0x800 >> 0xc;
  auVar8._0_4_ = auVar176._0_4_ + 0x800 >> 0xc;
  auVar8._4_4_ = auVar176._4_4_ + 0x800 >> 0xc;
  auVar8._8_4_ = auVar176._8_4_ + 0x800 >> 0xc;
  auVar8._12_4_ = auVar176._12_4_ + 0x800 >> 0xc;
  auVar4 = packssdw(auVar92,auVar8);
  auVar347 = pmaddwd(auVar237,auVar81);
  auVar176 = pmaddwd(auVar43,auVar81);
  auVar241._0_4_ = auVar347._0_4_ + 0x800 >> 0xc;
  auVar241._4_4_ = auVar347._4_4_ + 0x800 >> 0xc;
  auVar241._8_4_ = auVar347._8_4_ + 0x800 >> 0xc;
  auVar241._12_4_ = auVar347._12_4_ + 0x800 >> 0xc;
  auVar44._0_4_ = auVar176._0_4_ + 0x800 >> 0xc;
  auVar44._4_4_ = auVar176._4_4_ + 0x800 >> 0xc;
  auVar44._8_4_ = auVar176._8_4_ + 0x800 >> 0xc;
  auVar44._12_4_ = auVar176._12_4_ + 0x800 >> 0xc;
  auVar6 = packssdw(auVar241,auVar44);
  local_368 = auVar203._0_2_;
  uStack_366 = auVar203._2_2_;
  uStack_364 = auVar203._4_2_;
  uStack_362 = auVar203._6_2_;
  uStack_360 = auVar203._8_2_;
  uStack_35e = auVar203._10_2_;
  uStack_35c = auVar203._12_2_;
  uStack_35a = auVar203._14_2_;
  auVar355._0_12_ = auVar312._0_12_;
  auVar355._12_2_ = auVar312._6_2_;
  auVar355._14_2_ = uStack_362;
  auVar354._12_4_ = auVar355._12_4_;
  auVar354._0_10_ = auVar312._0_10_;
  auVar354._10_2_ = uStack_364;
  auVar353._10_6_ = auVar354._10_6_;
  auVar353._0_8_ = auVar312._0_8_;
  auVar353._8_2_ = auVar312._4_2_;
  auVar352._8_8_ = auVar353._8_8_;
  auVar352._6_2_ = uStack_366;
  auVar352._4_2_ = auVar312._2_2_;
  auVar352._0_2_ = auVar312._0_2_;
  auVar352._2_2_ = local_368;
  auVar45._2_2_ = uStack_360;
  auVar45._0_2_ = auVar312._8_2_;
  auVar45._4_2_ = auVar312._10_2_;
  auVar45._6_2_ = uStack_35e;
  auVar45._8_2_ = auVar312._12_2_;
  auVar45._10_2_ = uStack_35c;
  auVar45._12_2_ = auVar312._14_2_;
  auVar45._14_2_ = uStack_35a;
  auVar347 = pmaddwd(auVar352,auVar80);
  auVar176 = pmaddwd(auVar45,auVar80);
  auVar93._0_4_ = auVar347._0_4_ + 0x800 >> 0xc;
  auVar93._4_4_ = auVar347._4_4_ + 0x800 >> 0xc;
  auVar93._8_4_ = auVar347._8_4_ + 0x800 >> 0xc;
  auVar93._12_4_ = auVar347._12_4_ + 0x800 >> 0xc;
  auVar11._0_4_ = auVar176._0_4_ + 0x800 >> 0xc;
  auVar11._4_4_ = auVar176._4_4_ + 0x800 >> 0xc;
  auVar11._8_4_ = auVar176._8_4_ + 0x800 >> 0xc;
  auVar11._12_4_ = auVar176._12_4_ + 0x800 >> 0xc;
  auVar312 = packssdw(auVar93,auVar11);
  auVar347 = pmaddwd(auVar352,auVar81);
  auVar176 = pmaddwd(auVar45,auVar81);
  auVar356._0_4_ = auVar347._0_4_ + 0x800 >> 0xc;
  auVar356._4_4_ = auVar347._4_4_ + 0x800 >> 0xc;
  auVar356._8_4_ = auVar347._8_4_ + 0x800 >> 0xc;
  auVar356._12_4_ = auVar347._12_4_ + 0x800 >> 0xc;
  auVar46._0_4_ = auVar176._0_4_ + 0x800 >> 0xc;
  auVar46._4_4_ = auVar176._4_4_ + 0x800 >> 0xc;
  auVar46._8_4_ = auVar176._8_4_ + 0x800 >> 0xc;
  auVar46._12_4_ = auVar176._12_4_ + 0x800 >> 0xc;
  auVar277 = packssdw(auVar356,auVar46);
  local_358 = auVar130._0_2_;
  uStack_356 = auVar130._2_2_;
  uStack_354 = auVar130._4_2_;
  uStack_352 = auVar130._6_2_;
  uStack_350 = auVar130._8_2_;
  uStack_34e = auVar130._10_2_;
  uStack_34c = auVar130._12_2_;
  uStack_34a = auVar130._14_2_;
  auVar304._0_12_ = auVar78._0_12_;
  auVar304._12_2_ = auVar78._6_2_;
  auVar304._14_2_ = uStack_352;
  auVar303._12_4_ = auVar304._12_4_;
  auVar303._0_10_ = auVar78._0_10_;
  auVar303._10_2_ = uStack_354;
  auVar302._10_6_ = auVar303._10_6_;
  auVar302._0_8_ = auVar78._0_8_;
  auVar302._8_2_ = auVar78._4_2_;
  auVar301._8_8_ = auVar302._8_8_;
  auVar301._6_2_ = uStack_356;
  auVar301._4_2_ = auVar78._2_2_;
  auVar301._0_2_ = auVar78._0_2_;
  auVar301._2_2_ = local_358;
  auVar47._2_2_ = uStack_350;
  auVar47._0_2_ = auVar78._8_2_;
  auVar47._4_2_ = auVar78._10_2_;
  auVar47._6_2_ = uStack_34e;
  auVar47._8_2_ = auVar78._12_2_;
  auVar47._10_2_ = uStack_34c;
  auVar47._12_2_ = auVar78._14_2_;
  auVar47._14_2_ = uStack_34a;
  auVar347 = pmaddwd(auVar301,auVar80);
  auVar176 = pmaddwd(auVar47,auVar80);
  auVar94._0_4_ = auVar347._0_4_ + 0x800 >> 0xc;
  auVar94._4_4_ = auVar347._4_4_ + 0x800 >> 0xc;
  auVar94._8_4_ = auVar347._8_4_ + 0x800 >> 0xc;
  auVar94._12_4_ = auVar347._12_4_ + 0x800 >> 0xc;
  auVar130._0_4_ = auVar176._0_4_ + 0x800 >> 0xc;
  auVar130._4_4_ = auVar176._4_4_ + 0x800 >> 0xc;
  auVar130._8_4_ = auVar176._8_4_ + 0x800 >> 0xc;
  auVar130._12_4_ = auVar176._12_4_ + 0x800 >> 0xc;
  auVar78 = packssdw(auVar94,auVar130);
  auVar347 = pmaddwd(auVar301,auVar81);
  auVar176 = pmaddwd(auVar47,auVar81);
  auVar305._0_4_ = auVar347._0_4_ + 0x800 >> 0xc;
  auVar305._4_4_ = auVar347._4_4_ + 0x800 >> 0xc;
  auVar305._8_4_ = auVar347._8_4_ + 0x800 >> 0xc;
  auVar305._12_4_ = auVar347._12_4_ + 0x800 >> 0xc;
  auVar48._0_4_ = auVar176._0_4_ + 0x800 >> 0xc;
  auVar48._4_4_ = auVar176._4_4_ + 0x800 >> 0xc;
  auVar48._8_4_ = auVar176._8_4_ + 0x800 >> 0xc;
  auVar48._12_4_ = auVar176._12_4_ + 0x800 >> 0xc;
  auVar8 = packssdw(auVar305,auVar48);
  local_348 = auVar147._0_2_;
  uStack_346 = auVar147._2_2_;
  uStack_344 = auVar147._4_2_;
  uStack_342 = auVar147._6_2_;
  uStack_340 = auVar147._8_2_;
  uStack_33e = auVar147._10_2_;
  uStack_33c = auVar147._12_2_;
  uStack_33a = auVar147._14_2_;
  auVar285._0_12_ = auVar71._0_12_;
  auVar285._12_2_ = auVar71._6_2_;
  auVar285._14_2_ = uStack_342;
  auVar284._12_4_ = auVar285._12_4_;
  auVar284._0_10_ = auVar71._0_10_;
  auVar284._10_2_ = uStack_344;
  auVar283._10_6_ = auVar284._10_6_;
  auVar283._0_8_ = auVar71._0_8_;
  auVar283._8_2_ = auVar71._4_2_;
  auVar282._8_8_ = auVar283._8_8_;
  auVar282._6_2_ = uStack_346;
  auVar282._4_2_ = auVar71._2_2_;
  auVar282._0_2_ = auVar71._0_2_;
  auVar282._2_2_ = local_348;
  auVar49._2_2_ = uStack_340;
  auVar49._0_2_ = auVar71._8_2_;
  auVar49._4_2_ = auVar71._10_2_;
  auVar49._6_2_ = uStack_33e;
  auVar49._8_2_ = auVar71._12_2_;
  auVar49._10_2_ = uStack_33c;
  auVar49._12_2_ = auVar71._14_2_;
  auVar49._14_2_ = uStack_33a;
  auVar347 = pmaddwd(auVar282,auVar80);
  auVar176 = pmaddwd(auVar49,auVar80);
  auVar324._0_4_ = auVar347._0_4_ + 0x800 >> 0xc;
  auVar324._4_4_ = auVar347._4_4_ + 0x800 >> 0xc;
  auVar324._8_4_ = auVar347._8_4_ + 0x800 >> 0xc;
  auVar324._12_4_ = auVar347._12_4_ + 0x800 >> 0xc;
  auVar132._0_4_ = auVar176._0_4_ + 0x800 >> 0xc;
  auVar132._4_4_ = auVar176._4_4_ + 0x800 >> 0xc;
  auVar132._8_4_ = auVar176._8_4_ + 0x800 >> 0xc;
  auVar132._12_4_ = auVar176._12_4_ + 0x800 >> 0xc;
  auVar11 = packssdw(auVar324,auVar132);
  auVar347 = pmaddwd(auVar282,auVar81);
  auVar176 = pmaddwd(auVar49,auVar81);
  auVar286._0_4_ = auVar347._0_4_ + 0x800 >> 0xc;
  auVar286._4_4_ = auVar347._4_4_ + 0x800 >> 0xc;
  auVar286._8_4_ = auVar347._8_4_ + 0x800 >> 0xc;
  auVar286._12_4_ = auVar347._12_4_ + 0x800 >> 0xc;
  auVar50._0_4_ = auVar176._0_4_ + 0x800 >> 0xc;
  auVar50._4_4_ = auVar176._4_4_ + 0x800 >> 0xc;
  auVar50._8_4_ = auVar176._8_4_ + 0x800 >> 0xc;
  auVar50._12_4_ = auVar176._12_4_ + 0x800 >> 0xc;
  auVar147 = packssdw(auVar286,auVar50);
  local_128 = auVar254._0_2_;
  uStack_126 = auVar254._2_2_;
  uStack_124 = auVar254._4_2_;
  uStack_122 = auVar254._6_2_;
  uStack_120 = auVar254._8_2_;
  uStack_11e = auVar254._10_2_;
  uStack_11c = auVar254._12_2_;
  uStack_11a = auVar254._14_2_;
  auVar57._0_12_ = auVar66._0_12_;
  auVar57._12_2_ = auVar66._6_2_;
  auVar57._14_2_ = uStack_122;
  auVar189._12_4_ = auVar57._12_4_;
  auVar189._0_10_ = auVar66._0_10_;
  auVar189._10_2_ = uStack_124;
  auVar265._10_6_ = auVar189._10_6_;
  auVar265._0_8_ = auVar66._0_8_;
  auVar265._8_2_ = auVar66._4_2_;
  auVar203._8_8_ = auVar265._8_8_;
  auVar203._6_2_ = uStack_126;
  auVar203._4_2_ = auVar66._2_2_;
  auVar203._0_2_ = auVar66._0_2_;
  auVar203._2_2_ = local_128;
  auVar95._2_2_ = uStack_120;
  auVar95._0_2_ = auVar66._8_2_;
  auVar95._4_2_ = auVar66._10_2_;
  auVar95._6_2_ = uStack_11e;
  auVar95._8_2_ = auVar66._12_2_;
  auVar95._10_2_ = uStack_11c;
  auVar95._12_2_ = auVar66._14_2_;
  auVar95._14_2_ = uStack_11a;
  auVar347 = pmaddwd(auVar203,auVar80);
  auVar176 = pmaddwd(auVar95,auVar80);
  auVar186._0_4_ = auVar347._0_4_ + 0x800 >> 0xc;
  auVar186._4_4_ = auVar347._4_4_ + 0x800 >> 0xc;
  auVar186._8_4_ = auVar347._8_4_ + 0x800 >> 0xc;
  auVar186._12_4_ = auVar347._12_4_ + 0x800 >> 0xc;
  auVar51._0_4_ = auVar176._0_4_ + 0x800 >> 0xc;
  auVar51._4_4_ = auVar176._4_4_ + 0x800 >> 0xc;
  auVar51._8_4_ = auVar176._8_4_ + 0x800 >> 0xc;
  auVar51._12_4_ = auVar176._12_4_ + 0x800 >> 0xc;
  auVar71 = packssdw(auVar186,auVar51);
  auVar176 = pmaddwd(auVar203,auVar81);
  auVar347 = pmaddwd(auVar95,auVar81);
  auVar72._0_4_ = auVar176._0_4_ + 0x800 >> 0xc;
  auVar72._4_4_ = auVar176._4_4_ + 0x800 >> 0xc;
  auVar72._8_4_ = auVar176._8_4_ + 0x800 >> 0xc;
  auVar72._12_4_ = auVar176._12_4_ + 0x800 >> 0xc;
  auVar96._0_4_ = auVar347._0_4_ + 0x800 >> 0xc;
  auVar96._4_4_ = auVar347._4_4_ + 0x800 >> 0xc;
  auVar96._8_4_ = auVar347._8_4_ + 0x800 >> 0xc;
  auVar96._12_4_ = auVar347._12_4_ + 0x800 >> 0xc;
  auVar176 = packssdw(auVar72,auVar96);
  local_138 = auVar7._0_2_;
  uStack_136 = auVar7._2_2_;
  uStack_134 = auVar7._4_2_;
  uStack_132 = auVar7._6_2_;
  uStack_130 = auVar7._8_2_;
  uStack_12e = auVar7._10_2_;
  uStack_12c = auVar7._12_2_;
  uStack_12a = auVar7._14_2_;
  auVar100._0_12_ = auVar212._0_12_;
  auVar100._12_2_ = auVar212._6_2_;
  auVar100._14_2_ = uStack_132;
  auVar99._12_4_ = auVar100._12_4_;
  auVar99._0_10_ = auVar212._0_10_;
  auVar99._10_2_ = uStack_134;
  auVar98._10_6_ = auVar99._10_6_;
  auVar98._0_8_ = auVar212._0_8_;
  auVar98._8_2_ = auVar212._4_2_;
  auVar97._8_8_ = auVar98._8_8_;
  auVar97._6_2_ = uStack_136;
  auVar97._4_2_ = auVar212._2_2_;
  auVar97._0_2_ = auVar212._0_2_;
  auVar97._2_2_ = local_138;
  auVar173._2_2_ = uStack_130;
  auVar173._0_2_ = auVar212._8_2_;
  auVar173._4_2_ = auVar212._10_2_;
  auVar173._6_2_ = uStack_12e;
  auVar173._8_2_ = auVar212._12_2_;
  auVar173._10_2_ = uStack_12c;
  auVar173._12_2_ = auVar212._14_2_;
  auVar173._14_2_ = uStack_12a;
  auVar347 = pmaddwd(auVar97,auVar80);
  auVar7 = pmaddwd(auVar80,auVar173);
  auVar212 = pmaddwd(auVar97,auVar81);
  auVar66 = pmaddwd(auVar173,auVar81);
  auVar52._0_4_ = auVar347._0_4_ + 0x800 >> 0xc;
  auVar52._4_4_ = auVar347._4_4_ + 0x800 >> 0xc;
  auVar52._8_4_ = auVar347._8_4_ + 0x800 >> 0xc;
  auVar52._12_4_ = auVar347._12_4_ + 0x800 >> 0xc;
  auVar204._0_4_ = auVar7._0_4_ + 0x800 >> 0xc;
  auVar204._4_4_ = auVar7._4_4_ + 0x800 >> 0xc;
  auVar204._8_4_ = auVar7._8_4_ + 0x800 >> 0xc;
  auVar204._12_4_ = auVar7._12_4_ + 0x800 >> 0xc;
  auVar347 = packssdw(auVar52,auVar204);
  auVar101._0_4_ = auVar212._0_4_ + 0x800 >> 0xc;
  auVar101._4_4_ = auVar212._4_4_ + 0x800 >> 0xc;
  auVar101._8_4_ = auVar212._8_4_ + 0x800 >> 0xc;
  auVar101._12_4_ = auVar212._12_4_ + 0x800 >> 0xc;
  auVar174._0_4_ = auVar66._0_4_ + 0x800 >> 0xc;
  auVar174._4_4_ = auVar66._4_4_ + 0x800 >> 0xc;
  auVar174._8_4_ = auVar66._8_4_ + 0x800 >> 0xc;
  auVar174._12_4_ = auVar66._12_4_ + 0x800 >> 0xc;
  auVar212 = packssdw(auVar101,auVar174);
  alVar370 = (__m128i)paddsw(auVar268,auVar166);
  *output = alVar370;
  alVar370 = (__m128i)psubsw(auVar268,auVar166);
  output[0x3f] = alVar370;
  alVar370 = (__m128i)paddsw(auVar79,auVar233);
  output[1] = alVar370;
  alVar370 = (__m128i)psubsw(auVar79,auVar233);
  output[0x3e] = alVar370;
  alVar370 = (__m128i)paddsw(auVar310,auVar182);
  output[2] = alVar370;
  alVar370 = (__m128i)psubsw(auVar310,auVar182);
  output[0x3d] = alVar370;
  alVar370 = (__m128i)paddsw(auVar17,auVar263);
  output[3] = alVar370;
  alVar370 = (__m128i)psubsw(auVar17,auVar263);
  output[0x3c] = alVar370;
  alVar370 = (__m128i)paddsw(auVar367,auVar205);
  output[4] = alVar370;
  alVar370 = (__m128i)psubsw(auVar367,auVar205);
  output[0x3b] = alVar370;
  alVar370 = (__m128i)paddsw(auVar197,auVar139);
  output[5] = alVar370;
  alVar370 = (__m128i)psubsw(auVar197,auVar139);
  output[0x3a] = alVar370;
  alVar370 = (__m128i)paddsw(auVar55,auVar63);
  output[6] = alVar370;
  alVar370 = (__m128i)psubsw(auVar55,auVar63);
  output[0x39] = alVar370;
  alVar370 = (__m128i)paddsw(auVar199,auVar145);
  output[7] = alVar370;
  alVar370 = (__m128i)psubsw(auVar199,auVar145);
  output[0x38] = alVar370;
  alVar370 = (__m128i)paddsw(auVar269,auVar328);
  output[8] = alVar370;
  alVar370 = (__m128i)psubsw(auVar269,auVar328);
  output[0x37] = alVar370;
  alVar370 = (__m128i)paddsw(auVar296,auVar248);
  output[9] = alVar370;
  alVar370 = (__m128i)psubsw(auVar296,auVar248);
  output[0x36] = alVar370;
  alVar370 = (__m128i)paddsw(auVar115,auVar6);
  output[10] = alVar370;
  alVar370 = (__m128i)psubsw(auVar115,auVar6);
  output[0x35] = alVar370;
  alVar370 = (__m128i)paddsw(auVar201,auVar277);
  output[0xb] = alVar370;
  alVar370 = (__m128i)psubsw(auVar201,auVar277);
  output[0x34] = alVar370;
  alVar370 = (__m128i)paddsw(auVar288,auVar8);
  output[0xc] = alVar370;
  alVar370 = (__m128i)psubsw(auVar288,auVar8);
  output[0x33] = alVar370;
  alVar370 = (__m128i)paddsw(auVar110,auVar147);
  output[0xd] = alVar370;
  alVar370 = (__m128i)psubsw(auVar110,auVar147);
  output[0x32] = alVar370;
  alVar370 = (__m128i)paddsw(auVar366,auVar176);
  output[0xe] = alVar370;
  alVar370 = (__m128i)psubsw(auVar366,auVar176);
  output[0x31] = alVar370;
  alVar370 = (__m128i)paddsw(auVar330,auVar212);
  output[0xf] = alVar370;
  alVar370 = (__m128i)psubsw(auVar330,auVar212);
  output[0x30] = alVar370;
  alVar370 = (__m128i)paddsw(auVar228,auVar347);
  output[0x10] = alVar370;
  alVar370 = (__m128i)psubsw(auVar228,auVar347);
  output[0x2f] = alVar370;
  alVar370 = (__m128i)paddsw(auVar266,auVar71);
  output[0x11] = alVar370;
  alVar370 = (__m128i)psubsw(auVar266,auVar71);
  output[0x2e] = alVar370;
  alVar370 = (__m128i)paddsw(auVar121,auVar11);
  output[0x12] = alVar370;
  alVar370 = (__m128i)psubsw(auVar121,auVar11);
  output[0x2d] = alVar370;
  alVar370 = (__m128i)paddsw(auVar22,auVar78);
  output[0x13] = alVar370;
  alVar370 = (__m128i)psubsw(auVar22,auVar78);
  output[0x2c] = alVar370;
  alVar370 = (__m128i)paddsw(auVar5,auVar312);
  output[0x14] = alVar370;
  alVar370 = (__m128i)psubsw(auVar5,auVar312);
  output[0x2b] = alVar370;
  alVar370 = (__m128i)paddsw(auVar3,auVar4);
  output[0x15] = alVar370;
  alVar370 = (__m128i)psubsw(auVar3,auVar4);
  output[0x2a] = alVar370;
  alVar370 = (__m128i)paddsw(auVar1,auVar113);
  output[0x16] = alVar370;
  alVar370 = (__m128i)psubsw(auVar1,auVar113);
  output[0x29] = alVar370;
  alVar370 = (__m128i)paddsw(auVar360,auVar2);
  output[0x17] = alVar370;
  alVar370 = (__m128i)psubsw(auVar360,auVar2);
  output[0x28] = alVar370;
  alVar370 = (__m128i)paddsw(auVar327,auVar262);
  output[0x18] = alVar370;
  alVar370 = (__m128i)psubsw(auVar327,auVar262);
  output[0x27] = alVar370;
  alVar370 = (__m128i)paddsw(auVar246,auVar120);
  output[0x19] = alVar370;
  alVar370 = (__m128i)psubsw(auVar246,auVar120);
  output[0x26] = alVar370;
  alVar370 = (__m128i)paddsw(auVar191,auVar230);
  output[0x1a] = alVar370;
  alVar370 = (__m128i)psubsw(auVar191,auVar230);
  output[0x25] = alVar370;
  alVar370 = (__m128i)paddsw(auVar188,auVar68);
  output[0x1b] = alVar370;
  alVar370 = (__m128i)psubsw(auVar188,auVar68);
  output[0x24] = alVar370;
  alVar370 = (__m128i)paddsw(auVar325,auVar256);
  output[0x1c] = alVar370;
  alVar370 = (__m128i)psubsw(auVar325,auVar256);
  output[0x23] = alVar370;
  alVar370 = (__m128i)paddsw(auVar178,auVar337);
  output[0x1d] = alVar370;
  alVar370 = (__m128i)psubsw(auVar178,auVar337);
  output[0x22] = alVar370;
  alVar370 = (__m128i)paddsw(auVar243,auVar336);
  output[0x1e] = alVar370;
  alVar370 = (__m128i)psubsw(auVar243,auVar336);
  output[0x21] = alVar370;
  alVar370 = (__m128i)paddsw(auVar206,auVar331);
  output[0x1f] = alVar370;
  alVar370 = (__m128i)psubsw(auVar206,auVar331);
  output[0x20] = alVar370;
  return;
}

Assistant:

static void idct64_low8_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));
  const __m128i cospi_m04_p60 = pair_set_epi16(-cospi[4], cospi[60]);
  const __m128i cospi_p60_p04 = pair_set_epi16(cospi[60], cospi[4]);
  const __m128i cospi_m36_p28 = pair_set_epi16(-cospi[36], cospi[28]);
  const __m128i cospi_m28_m36 = pair_set_epi16(-cospi[28], -cospi[36]);
  const __m128i cospi_m20_p44 = pair_set_epi16(-cospi[20], cospi[44]);
  const __m128i cospi_p44_p20 = pair_set_epi16(cospi[44], cospi[20]);
  const __m128i cospi_m52_p12 = pair_set_epi16(-cospi[52], cospi[12]);
  const __m128i cospi_m12_m52 = pair_set_epi16(-cospi[12], -cospi[52]);
  const __m128i cospi_m08_p56 = pair_set_epi16(-cospi[8], cospi[56]);
  const __m128i cospi_p56_p08 = pair_set_epi16(cospi[56], cospi[8]);
  const __m128i cospi_m40_p24 = pair_set_epi16(-cospi[40], cospi[24]);
  const __m128i cospi_m24_m40 = pair_set_epi16(-cospi[24], -cospi[40]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[64];
  x[0] = input[0];
  x[8] = input[4];
  x[16] = input[2];
  x[24] = input[6];
  x[32] = input[1];
  x[40] = input[5];
  x[48] = input[3];
  x[56] = input[7];

  // stage 2
  btf_16_ssse3(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_ssse3(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_ssse3(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_ssse3(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);
  x[33] = x[32];
  x[38] = x[39];
  x[41] = x[40];
  x[46] = x[47];
  x[49] = x[48];
  x[54] = x[55];
  x[57] = x[56];
  x[62] = x[63];

  // stage 4
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  x[17] = x[16];
  x[22] = x[23];
  x[25] = x[24];
  x[30] = x[31];
  btf_16_sse2(cospi_m04_p60, cospi_p60_p04, x[33], x[62], x[33], x[62]);
  btf_16_sse2(cospi_m28_m36, cospi_m36_p28, x[38], x[57], x[38], x[57]);
  btf_16_sse2(cospi_m20_p44, cospi_p44_p20, x[41], x[54], x[41], x[54]);
  btf_16_sse2(cospi_m12_m52, cospi_m52_p12, x[46], x[49], x[46], x[49]);

  // stage 5
  x[9] = x[8];
  x[14] = x[15];
  btf_16_sse2(cospi_m08_p56, cospi_p56_p08, x[17], x[30], x[17], x[30]);
  btf_16_sse2(cospi_m24_m40, cospi_m40_p24, x[22], x[25], x[22], x[25]);
  x[35] = x[32];
  x[34] = x[33];
  x[36] = x[39];
  x[37] = x[38];
  x[43] = x[40];
  x[42] = x[41];
  x[44] = x[47];
  x[45] = x[46];
  x[51] = x[48];
  x[50] = x[49];
  x[52] = x[55];
  x[53] = x[54];
  x[59] = x[56];
  x[58] = x[57];
  x[60] = x[63];
  x[61] = x[62];

  // stage 6
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  x[19] = x[16];
  x[18] = x[17];
  x[20] = x[23];
  x[21] = x[22];
  x[27] = x[24];
  x[26] = x[25];
  x[28] = x[31];
  x[29] = x[30];
  idct64_stage6_high32_sse2(x, cospi, __rounding, cos_bit);

  // stage 7
  x[3] = x[0];
  x[2] = x[1];
  x[11] = x[8];
  x[10] = x[9];
  x[12] = x[15];
  x[13] = x[14];
  idct64_stage7_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 8
  x[7] = x[0];
  x[6] = x[1];
  x[5] = x[2];
  x[4] = x[3];
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);
  idct64_stage8_high48_sse2(x, cospi, __rounding, cos_bit);

  idct64_stage9_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage10_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage11_sse2(output, x);
}